

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniminer_tests.cpp
# Opt level: O2

void __thiscall miniminer_tests::miniminer_overlap::test_method(miniminer_overlap *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  CTxMemPool *this_00;
  element_type *peVar3;
  CTxMemPoolEntry *pCVar4;
  uchar *puVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uint256 *puVar10;
  base_blob<256U> *pbVar11;
  pointer pCVar12;
  bool bVar13;
  uint uVar14;
  unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *puVar15;
  CTxMemPoolEntry **ppCVar16;
  iterator iVar17;
  CAmount CVar18;
  long lVar19;
  iterator pvVar20;
  char *pcVar21;
  allocator_type *__a;
  iterator pvVar22;
  MiniMiner *pMVar23;
  _Base_ptr *pp_Var24;
  vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *pvVar25;
  map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
  *pmVar26;
  optional<long> *poVar27;
  COutPoint *outpoint;
  pointer outpoint_00;
  bool *map;
  shared_ptr<const_CTransaction> *tx;
  pointer psVar28;
  long in_FS_OFFSET;
  initializer_list<COutPoint> __l;
  initializer_list<COutPoint> __l_00;
  initializer_list<COutPoint> __l_01;
  initializer_list<COutPoint> __l_02;
  initializer_list<COutPoint> __l_03;
  initializer_list<COutPoint> __l_04;
  initializer_list<COutPoint> __l_05;
  initializer_list<COutPoint> __l_06;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_07;
  initializer_list<COutPoint> __l_08;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  initializer_list<COutPoint> __l_09;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  initializer_list<COutPoint> __l_10;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  initializer_list<COutPoint> __l_11;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  initializer_list<transaction_identifier<false>_> __l_12;
  initializer_list<transaction_identifier<false>_> __l_13;
  initializer_list<transaction_identifier<false>_> __l_14;
  initializer_list<transaction_identifier<false>_> __l_15;
  initializer_list<transaction_identifier<false>_> __l_16;
  initializer_list<transaction_identifier<false>_> __l_17;
  initializer_list<transaction_identifier<false>_> __l_18;
  initializer_list<transaction_identifier<false>_> __l_19;
  const_string file_48;
  const_string file_49;
  const_string file_50;
  const_string file_51;
  const_string file_52;
  const_string file_53;
  const_string file_54;
  const_string file_55;
  const_string file_56;
  const_string file_57;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string msg_52;
  const_string msg_53;
  const_string msg_54;
  const_string msg_55;
  const_string msg_56;
  const_string msg_57;
  optional<long> oVar29;
  check_type cVar34;
  _Base_ptr p_Var30;
  MiniMiner *pMVar31;
  assertion_result *paVar32;
  assertion_result *paVar33;
  char *local_11f8;
  char *local_11f0;
  undefined1 *local_11e8;
  undefined1 *local_11e0;
  char *local_11d8;
  char *local_11d0;
  char *local_11c8;
  char *local_11c0;
  undefined1 *local_11b8;
  undefined1 *local_11b0;
  char *local_11a8;
  char *local_11a0;
  char *local_1198;
  char *local_1190;
  undefined1 *local_1188;
  undefined1 *local_1180;
  char *local_1178;
  char *local_1170;
  char *local_1168;
  char *local_1160;
  undefined1 *local_1158;
  undefined1 *local_1150;
  char *local_1148;
  char *local_1140;
  char *local_1138;
  char *local_1130;
  undefined1 *local_1128;
  undefined1 *local_1120;
  char *local_1118;
  char *local_1110;
  char *local_1108;
  char *local_1100;
  undefined1 *local_10f8;
  undefined1 *local_10f0;
  char *local_10e8;
  char *local_10e0;
  char *local_10d8;
  char *local_10d0;
  undefined1 *local_10c8;
  undefined1 *local_10c0;
  char *local_10b8;
  char *local_10b0;
  char *local_10a8;
  char *local_10a0;
  undefined1 *local_1098;
  undefined1 *local_1090;
  char *local_1088;
  char *local_1080;
  char *local_1078;
  char *local_1070;
  undefined1 *local_1068;
  undefined1 *local_1060;
  char *local_1058;
  char *local_1050;
  char *local_1048;
  char *local_1040;
  undefined1 *local_1038;
  undefined1 *local_1030;
  char *local_1028;
  char *local_1020;
  char *local_1018;
  char *local_1010;
  undefined1 *local_1008;
  undefined1 *local_1000;
  char *local_ff8;
  char *local_ff0;
  char *local_fe8;
  char *local_fe0;
  undefined1 *local_fd8;
  undefined1 *local_fd0;
  char *local_fc8;
  char *local_fc0;
  char *local_fb8;
  char *local_fb0;
  undefined1 *local_fa8;
  undefined1 *local_fa0;
  char *local_f98;
  char *local_f90;
  char *local_f88;
  char *local_f80;
  undefined1 *local_f78;
  undefined1 *local_f70;
  char *local_f68;
  char *local_f60;
  char *local_f58;
  char *local_f50;
  undefined1 *local_f48;
  undefined1 *local_f40;
  char *local_f38;
  char *local_f30;
  char *local_f28;
  char *local_f20;
  undefined1 *local_f18;
  undefined1 *local_f10;
  char *local_f08;
  char *local_f00;
  char *local_ef8;
  char *local_ef0;
  undefined1 *local_ee8;
  undefined1 *local_ee0;
  char *local_ed8;
  char *local_ed0;
  char *local_ec8;
  char *local_ec0;
  undefined1 *local_eb8;
  undefined1 *local_eb0;
  char *local_ea8;
  char *local_ea0;
  char *local_e98;
  char *local_e90;
  undefined1 *local_e88;
  undefined1 *local_e80;
  char *local_e78;
  char *local_e70;
  char *local_e68;
  char *local_e60;
  undefined1 *local_e58;
  undefined1 *local_e50;
  char *local_e48;
  char *local_e40;
  char *local_e38;
  char *local_e30;
  undefined1 *local_e28;
  undefined1 *local_e20;
  char *local_e18;
  char *local_e10;
  char *local_e08;
  char *local_e00;
  undefined1 *local_df8;
  undefined1 *local_df0;
  char *local_de8;
  char *local_de0;
  char *local_dd8;
  char *local_dd0;
  undefined1 *local_dc8;
  undefined1 *local_dc0;
  char *local_db8;
  char *local_db0;
  char *local_da8;
  char *local_da0;
  undefined1 *local_d98;
  undefined1 *local_d90;
  char *local_d88;
  char *local_d80;
  char *local_d78;
  char *local_d70;
  undefined1 *local_d68;
  undefined1 *local_d60;
  char *local_d58;
  char *local_d50;
  char *local_d48;
  char *local_d40;
  undefined1 *local_d38;
  undefined1 *local_d30;
  char *local_d28;
  char *local_d20;
  char *local_d18;
  char *local_d10;
  undefined1 *local_d08;
  undefined1 *local_d00;
  char *local_cf8;
  char *local_cf0;
  char *local_ce8;
  char *local_ce0;
  undefined1 *local_cd8;
  undefined1 *local_cd0;
  char *local_cc8;
  char *local_cc0;
  char *local_cb8;
  char *local_cb0;
  undefined1 *local_ca8;
  undefined1 *local_ca0;
  char *local_c98;
  char *local_c90;
  char *local_c88;
  char *local_c80;
  undefined1 *local_c78;
  undefined1 *local_c70;
  char *local_c68;
  char *local_c60;
  char *local_c58;
  char *local_c50;
  undefined1 *local_c48;
  undefined1 *local_c40;
  char *local_c38;
  char *local_c30;
  char *local_c28;
  char *local_c20;
  undefined1 *local_c18;
  undefined1 *local_c10;
  char *local_c08;
  char *local_c00;
  char *local_bf8;
  char *local_bf0;
  undefined1 *local_be8;
  undefined1 *local_be0;
  char *local_bd8;
  char *local_bd0;
  char *local_bc8;
  char *local_bc0;
  char *local_bb8;
  _Base_ptr local_bb0;
  _Base_ptr local_ba8;
  _Base_ptr local_ba0;
  char *local_b98;
  char *local_b90;
  char *local_b88;
  char *local_b80;
  undefined1 *local_b78;
  undefined1 *local_b70;
  char *local_b68;
  char *local_b60;
  char *local_b58;
  char *local_b50;
  undefined1 *local_b48;
  undefined1 *local_b40;
  char *local_b38;
  char *local_b30;
  char *local_b28;
  char *local_b20;
  undefined1 *local_b18;
  undefined1 *local_b10;
  char *local_b08;
  char *local_b00;
  char *local_af8;
  char *local_af0;
  undefined1 *local_ae8;
  undefined1 *local_ae0;
  char *local_ad8;
  char *local_ad0;
  char *local_ac8;
  char *local_ac0;
  undefined1 *local_ab8;
  undefined1 *local_ab0;
  char *local_aa8;
  char *local_aa0;
  char *local_a98;
  char *local_a90;
  undefined1 *local_a88;
  undefined1 *local_a80;
  char *local_a78;
  char *local_a70;
  char *local_a68;
  char *local_a60;
  undefined1 *local_a58;
  undefined1 *local_a50;
  char *local_a48;
  char *local_a40;
  char *local_a38;
  char *local_a30;
  undefined1 *local_a28;
  undefined1 *local_a20;
  char *local_a18;
  char *local_a10;
  char *local_a08;
  char *local_a00;
  undefined1 *local_9f8;
  undefined1 *local_9f0;
  char *local_9e8;
  char *local_9e0;
  char *local_9d8;
  char *local_9d0;
  undefined1 *local_9c8;
  undefined1 *local_9c0;
  char *local_9b8;
  char *local_9b0;
  char *local_9a8;
  char *local_9a0;
  undefined1 *local_998;
  undefined1 *local_990;
  char *local_988;
  char *local_980;
  char *local_978;
  char *local_970;
  undefined1 *local_968;
  undefined1 *local_960;
  char *local_958;
  char *local_950;
  char *local_948;
  char *local_940;
  undefined1 *local_938;
  undefined1 *local_930;
  char *local_928;
  char *local_920;
  char *local_918;
  char *local_910;
  undefined1 *local_908;
  undefined1 *local_900;
  char *local_8f8;
  char *local_8f0;
  char *local_8e8;
  char *local_8e0;
  undefined1 *local_8d8;
  undefined1 *local_8d0;
  char *local_8c8;
  char *local_8c0;
  char *local_8b8;
  char *local_8b0;
  undefined1 *local_8a8;
  undefined1 *local_8a0;
  char *local_898;
  char *local_890;
  char *local_888;
  char *local_880;
  undefined1 *local_878;
  undefined1 *local_870;
  char *local_868;
  char *local_860;
  char *local_858;
  char *local_850;
  undefined1 *local_848;
  undefined1 *local_840;
  char *local_838;
  char *local_830;
  CFeeRate very_high_feerate;
  char *local_820;
  char *local_818;
  undefined1 *local_810;
  undefined1 *local_808;
  char *local_800;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  undefined1 *local_7e0;
  undefined1 *local_7d8;
  char *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  undefined1 *local_7b0;
  undefined1 *local_7a8;
  char *local_7a0;
  char *local_798;
  CFeeRate tx7_anc_feerate;
  char *local_788;
  char *local_780;
  undefined1 *local_778;
  undefined1 *local_770;
  char *local_768;
  char *local_760;
  CFeeRate tx6_anc_feerate;
  CFeeRate tx4_feerate;
  char *local_748;
  char *local_740;
  undefined1 *local_738;
  undefined1 *local_730;
  char *local_728;
  char *local_720;
  CFeeRate tx3_anc_feerate;
  char *local_710;
  char *local_708;
  undefined1 *local_700;
  undefined1 *local_6f8;
  char *local_6f0;
  char *local_6e8;
  CFeeRate tx3_feerate;
  CFeeRate tx2_feerate;
  char *local_6d0;
  char *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  char *local_6b0;
  char *local_6a8;
  vector<COutPoint,_std::allocator<COutPoint>_> all_unspent_outpoints;
  vector<long,_std::allocator<long>_> tx_vsizes;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  all_transactions;
  CTransactionRef tx7;
  CTransactionRef tx6;
  CTransactionRef tx5;
  CTransactionRef tx4;
  CTransactionRef tx3;
  CTransactionRef tx2;
  CTransactionRef tx1;
  CTransactionRef tx0;
  TestMemPoolEntryHelper entry;
  optional<long> tx6_tx7_bumpfee;
  vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> miniminer_info;
  optional<long> tx3_bump_fee;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
  descendant_caches;
  MiniMiner mini_miner_tx6_tx7;
  MiniMiner miniminer_pool;
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  bump_fees;
  MiniMiner miniminer_manual;
  
  local_1030 = (undefined1 *)0x0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  puVar15 = inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
                      (&(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                        super_BasicTestingSetup.m_node.mempool,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
                       ,0x192,"test_method","m_node.mempool");
  this_00 = (puVar15->_M_t).super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t
            .super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock1,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
             ,0x193,false);
  pvVar20 = (iterator)0x193;
  pvVar22 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock2,&this_00->cs,"pool.cs",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
             ,0x193,false);
  entry.nFee = 0;
  entry.time.__d.__r = (duration)0;
  entry.nHeight = 1;
  entry.m_sequence = 0;
  entry.spendsCoinbase = false;
  entry.sigOpCost = 4;
  entry.lp.height = 0;
  entry.lp.time = 0;
  entry.lp.maxInputBlock = (CBlockIndex *)0x0;
  peVar3 = (((this->super_TestChain100Setup).m_coinbase_txns.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  miniminer_manual._0_8_ = *(undefined8 *)&(peVar3->hash).m_wrapped;
  puVar5 = (uchar *)((long)&peVar3->hash + 8);
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = puVar5[0];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = puVar5[1];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = puVar5[2];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = puVar5[3];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = puVar5[4];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = puVar5[5];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = puVar5[6];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = puVar5[7];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)((long)&peVar3->hash + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)((long)&peVar3->hash + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  __l._M_len = 1;
  __l._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l,
             (allocator_type *)&mini_miner_tx6_tx7);
  make_tx((miniminer_tests *)&tx0,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,2
         );
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool);
  entry.nFee = 500;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx0);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&miniminer_manual);
  peVar3 = (this->super_TestChain100Setup).m_coinbase_txns.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  miniminer_manual._0_8_ = *(undefined8 *)&(peVar3->hash).m_wrapped;
  puVar5 = (uchar *)((long)&peVar3->hash + 8);
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = puVar5[0];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = puVar5[1];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = puVar5[2];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = puVar5[3];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = puVar5[4];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = puVar5[5];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = puVar5[6];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = puVar5[7];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)((long)&peVar3->hash + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)((long)&peVar3->hash + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l_00,
             (allocator_type *)&mini_miner_tx6_tx7);
  make_tx((miniminer_tests *)&tx1,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,2
         );
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool);
  entry.nFee = 5000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx1);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&miniminer_manual);
  peVar3 = (this->super_TestChain100Setup).m_coinbase_txns.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  miniminer_manual._0_8_ = *(undefined8 *)&(peVar3->hash).m_wrapped;
  puVar5 = (uchar *)((long)&peVar3->hash + 8);
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = puVar5[0];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = puVar5[1];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = puVar5[2];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = puVar5[3];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = puVar5[4];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = puVar5[5];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = puVar5[6];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = puVar5[7];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)((long)&peVar3->hash + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)((long)&peVar3->hash + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l_01,
             (allocator_type *)&mini_miner_tx6_tx7);
  make_tx((miniminer_tests *)&tx2,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,2
         );
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool);
  entry.nFee = 100000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx2);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&miniminer_manual);
  puVar10 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped;
  miniminer_manual.m_ready_to_calculate = (bool)(puVar10->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_manual._1_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_manual._2_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_manual._3_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_manual._4_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_manual._5_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_manual._6_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_manual._7_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[7];
  pbVar11 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar11->m_data)._M_elems[8];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar11->m_data)._M_elems[9];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar11->m_data)._M_elems[10];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar11->m_data)._M_elems[0xb];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar11->m_data)._M_elems[0xc];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar11->m_data)._M_elems[0xd];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar11->m_data)._M_elems[0xe];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar11->m_data)._M_elems[0xf];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  uVar6 = *(undefined8 *)
           ((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
           m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar7 = *(undefined8 *)
           (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar8 = *(undefined8 *)
           (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar9 = *(undefined8 *)
           (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
       (undefined4)uVar6;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ =
       (undefined4)((ulong)uVar6 >> 0x20);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ =
       (undefined4)uVar7;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
       (undefined4)((ulong)uVar7 >> 0x20);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
       (undefined4)uVar8;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84((ulong)uVar8 >> 0x20,0);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ = SUB84(uVar9,0);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = (_Rb_tree_color)((ulong)uVar9 >> 0x20);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._4_4_
       = 0;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = *(_Base_ptr *)
               ((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = *(_Base_ptr *)
             (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash
              ).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = *(_Base_ptr *)
              (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_node_count =
       *(size_t *)
        (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_inclusion_order._M_t._M_impl._0_4_ = 0;
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l_02,
             (allocator_type *)&mini_miner_tx6_tx7);
  make_tx((miniminer_tests *)&tx3,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,3
         );
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool);
  entry.nFee = 100000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx3);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&miniminer_manual);
  peVar3 = (this->super_TestChain100Setup).m_coinbase_txns.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[3].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  miniminer_manual._0_8_ = *(undefined8 *)&(peVar3->hash).m_wrapped;
  puVar5 = (uchar *)((long)&peVar3->hash + 8);
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = puVar5[0];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = puVar5[1];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = puVar5[2];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = puVar5[3];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = puVar5[4];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = puVar5[5];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = puVar5[6];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = puVar5[7];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)((long)&peVar3->hash + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)((long)&peVar3->hash + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l_03,
             (allocator_type *)&mini_miner_tx6_tx7);
  make_tx((miniminer_tests *)&tx4,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,2
         );
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool);
  entry.nFee = 100000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx4);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&miniminer_manual);
  puVar10 = &((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped;
  miniminer_manual.m_ready_to_calculate = (bool)(puVar10->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_manual._1_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_manual._2_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_manual._3_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_manual._4_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_manual._5_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_manual._6_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_manual._7_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[7];
  pbVar11 = &((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar11->m_data)._M_elems[8];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar11->m_data)._M_elems[9];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar11->m_data)._M_elems[10];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar11->m_data)._M_elems[0xb];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar11->m_data)._M_elems[0xc];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar11->m_data)._M_elems[0xd];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar11->m_data)._M_elems[0xe];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar11->m_data)._M_elems[0xf];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l_04,
             (allocator_type *)&mini_miner_tx6_tx7);
  make_tx((miniminer_tests *)&tx5,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,3
         );
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool);
  entry.nFee = 500;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx5);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&miniminer_manual);
  puVar10 = &((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped;
  miniminer_manual.m_ready_to_calculate = (bool)(puVar10->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_manual._1_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_manual._2_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_manual._3_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_manual._4_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_manual._5_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_manual._6_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_manual._7_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[7];
  pbVar11 = &((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar11->m_data)._M_elems[8];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar11->m_data)._M_elems[9];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar11->m_data)._M_elems[10];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar11->m_data)._M_elems[0xb];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar11->m_data)._M_elems[0xc];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar11->m_data)._M_elems[0xd];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar11->m_data)._M_elems[0xe];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar11->m_data)._M_elems[0xf];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l_05,
             (allocator_type *)&mini_miner_tx6_tx7);
  make_tx((miniminer_tests *)&tx6,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,2
         );
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool);
  entry.nFee = 5000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx6);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&miniminer_manual);
  puVar10 = &((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped;
  miniminer_manual.m_ready_to_calculate = (bool)(puVar10->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_manual._1_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_manual._2_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_manual._3_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_manual._4_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_manual._5_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_manual._6_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_manual._7_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[7];
  pbVar11 = &((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar11->m_data)._M_elems[8];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar11->m_data)._M_elems[9];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar11->m_data)._M_elems[10];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar11->m_data)._M_elems[0xb];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar11->m_data)._M_elems[0xc];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar11->m_data)._M_elems[0xd];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar11->m_data)._M_elems[0xe];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar11->m_data)._M_elems[0xf];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 1;
  __l_06._M_len = 1;
  __l_06._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l_06,
             (allocator_type *)&mini_miner_tx6_tx7);
  make_tx((miniminer_tests *)&tx7,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,2
         );
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool);
  entry.nFee = 100000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx7);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&miniminer_manual);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&miniminer_manual,
             &tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header,
             &tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left
             ,&tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header,
             &tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header.
              _M_header._M_left,
             &tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header.
              _M_node_count,&tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
  ;
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header,
             &tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_07._M_len = 8;
  __l_07._M_array = (iterator)&miniminer_manual;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&all_transactions,__l_07,(allocator_type *)&miniminer_pool);
  lVar19 = 0x78;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               (&miniminer_manual.m_ready_to_calculate + lVar19));
    lVar19 = lVar19 + -0x10;
  } while (lVar19 != -8);
  tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<long,_std::allocator<long>_>::reserve
            (&tx_vsizes,
             (long)all_transactions.
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)all_transactions.
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  for (psVar28 = all_transactions.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      psVar28 !=
      all_transactions.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; psVar28 = psVar28 + 1) {
    miniminer_manual._0_8_ =
         GetVirtualTransactionSize
                   ((psVar28->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr,0,0);
    std::vector<long,_std::allocator<long>_>::emplace_back<long>
              (&tx_vsizes,(long *)&miniminer_manual);
  }
  puVar10 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped;
  miniminer_manual.m_ready_to_calculate = (bool)(puVar10->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_manual._1_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_manual._2_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_manual._3_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_manual._4_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_manual._5_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_manual._6_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_manual._7_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[7];
  pbVar11 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar11->m_data)._M_elems[8];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar11->m_data)._M_elems[9];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar11->m_data)._M_elems[10];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar11->m_data)._M_elems[0xb];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar11->m_data)._M_elems[0xc];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar11->m_data)._M_elems[0xd];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar11->m_data)._M_elems[0xe];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar11->m_data)._M_elems[0xf];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 1;
  uVar6 = *(undefined8 *)
           ((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
           m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar7 = *(undefined8 *)
           (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar8 = *(undefined8 *)
           (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar9 = *(undefined8 *)
           (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
       (undefined4)uVar6;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ =
       (undefined4)((ulong)uVar6 >> 0x20);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ =
       (undefined4)uVar7;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
       (undefined4)((ulong)uVar7 >> 0x20);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
       (undefined4)uVar8;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84((ulong)uVar8 >> 0x20,0);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ = SUB84(uVar9,0);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = (_Rb_tree_color)((ulong)uVar9 >> 0x20);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = *(_Base_ptr *)
               ((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = *(_Base_ptr *)
             (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash
              ).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = *(_Base_ptr *)
              (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_node_count =
       *(size_t *)
        (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  uVar6 = *(undefined8 *)
           ((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
           m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar7 = *(undefined8 *)
           (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar8 = *(undefined8 *)
           (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._20_8_ =
       *(undefined8 *)
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
       (undefined4)uVar8;
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
       (undefined4)((ulong)uVar8 >> 0x20);
  miniminer_manual.m_inclusion_order._M_t._M_impl._4_4_ = SUB84(uVar6,0);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       (_Rb_tree_color)((ulong)uVar6 >> 0x20);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
       SUB84(uVar7,0);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
       (undefined4)((ulong)uVar7 >> 0x20);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ = 0
  ;
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_node_count =
       *(size_t *)
        ((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  pbVar11 = &((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_bump_fees._M_t._M_impl._0_1_ = (pbVar11->m_data)._M_elems[8];
  miniminer_manual.m_bump_fees._M_t._M_impl._1_1_ = (pbVar11->m_data)._M_elems[9];
  miniminer_manual.m_bump_fees._M_t._M_impl._2_1_ = (pbVar11->m_data)._M_elems[10];
  miniminer_manual.m_bump_fees._M_t._M_impl._3_1_ = (pbVar11->m_data)._M_elems[0xb];
  miniminer_manual.m_bump_fees._M_t._M_impl._4_1_ = (pbVar11->m_data)._M_elems[0xc];
  miniminer_manual.m_bump_fees._M_t._M_impl._5_1_ = (pbVar11->m_data)._M_elems[0xd];
  miniminer_manual.m_bump_fees._M_t._M_impl._6_1_ = (pbVar11->m_data)._M_elems[0xe];
  miniminer_manual.m_bump_fees._M_t._M_impl._7_1_ = (pbVar11->m_data)._M_elems[0xf];
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._20_8_ =
       *(undefined8 *)
        ((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._28_8_ =
       *(undefined8 *)
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual._196_8_ =
       *(undefined8 *)
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_in_block._M_t._M_impl._4_8_ =
       *(undefined8 *)
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 2;
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        ((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       *(_Base_ptr *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       *(_Base_ptr *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_node_count =
       *(size_t *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual._252_8_ =
       *(undefined8 *)
        ((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  pbVar11 = &((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual._260_1_ = (pbVar11->m_data)._M_elems[8];
  miniminer_manual._261_1_ = (pbVar11->m_data)._M_elems[9];
  miniminer_manual._262_1_ = (pbVar11->m_data)._M_elems[10];
  miniminer_manual._263_1_ = (pbVar11->m_data)._M_elems[0xb];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._0_1_ = (pbVar11->m_data)._M_elems[0xc];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._1_1_ = (pbVar11->m_data)._M_elems[0xd];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._2_1_ = (pbVar11->m_data)._M_elems[0xe];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._3_1_ = (pbVar11->m_data)._M_elems[0xf];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._4_8_ =
       *(undefined8 *)
        (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_entries_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._4_8_ =
       *(undefined8 *)
        (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_entries_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       *(_Base_ptr *)
        ((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  miniminer_manual.m_entries_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       *(_Base_ptr *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual.m_entries_by_txid._M_t._M_impl.super__Rb_tree_header._M_node_count =
       *(size_t *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_entries.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       *(pointer *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_entries.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  miniminer_manual.m_entries.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._12_8_ =
       *(undefined8 *)
        ((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  miniminer_manual._332_8_ =
       *(undefined8 *)
        (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual.m_descendant_set_by_txid._M_t._M_impl._4_8_ =
       *(undefined8 *)
        (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_descendant_set_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._4_8_ =
       *(undefined8 *)
        (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_descendant_set_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._M_parent.
  _4_4_ = 0;
  __l_08._M_len = 10;
  __l_08._M_array = (iterator)&miniminer_manual;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._4_4_
       = miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left.
         _0_4_;
  miniminer_manual.m_inclusion_order._M_t._M_impl._0_4_ =
       miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_;
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
       miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_;
  miniminer_manual.m_total_fees._0_4_ =
       miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_;
  miniminer_manual.m_entries_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
       miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            (&all_unspent_outpoints,__l_08,(allocator_type *)&miniminer_pool);
  pCVar12 = all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (outpoint_00 = all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>
                     ._M_impl.super__Vector_impl_data._M_start; outpoint_00 != pCVar12;
      outpoint_00 = outpoint_00 + 1) {
    local_6b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
    ;
    local_6a8 = "";
    local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x1bb;
    file.m_begin = (iterator)&local_6b0;
    msg.m_end = pvVar22;
    msg.m_begin = pvVar20;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_6c0,msg);
    bVar13 = CTxMemPool::isSpent(this_00,outpoint_00);
    miniminer_pool.m_ready_to_calculate = !bVar13;
    miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
    mini_miner_tx6_tx7._0_8_ = anon_var_dwarf_90dec9;
    mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ = "";
    miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ =
         miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
    miniminer_manual._0_8_ = &PTR__lazy_ostream_011481f0;
    miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         boost::unit_test::lazy_ostream::inst;
    miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&mini_miner_tx6_tx7;
    local_6d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
    ;
    local_6c8 = "";
    pvVar20 = &DAT_00000001;
    pvVar22 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&miniminer_pool,(lazy_ostream *)&miniminer_manual,1,0,WARN,
               _cVar34,(size_t)&local_6d0,0x1bb);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  }
  CFeeRate::CFeeRate(&tx2_feerate,&high_fee,
                     *(uint32_t *)
                      (tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start + 2));
  CFeeRate::CFeeRate(&tx3_feerate,&high_fee,
                     *(uint32_t *)
                      (tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start + 3));
  local_6f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_6e8 = "";
  local_700 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1c0;
  file_00.m_begin = (iterator)&local_6f0;
  msg_00.m_end = pvVar22;
  msg_00.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_700,
             msg_00);
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  mini_miner_tx6_tx7._0_8_ = anon_var_dwarf_90e178;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ = (long)"tx2_feerate > tx3_feerate" + 0x19;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
  miniminer_manual._0_8_ = &PTR__lazy_ostream_011481f0;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&mini_miner_tx6_tx7;
  local_710 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_708 = "";
  pvVar20 = (iterator)0x0;
  miniminer_pool.m_ready_to_calculate = tx3_feerate.nSatoshisPerK < tx2_feerate.nSatoshisPerK;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&miniminer_pool,(lazy_ostream *)&miniminer_manual,1,0,WARN,_cVar34,
             (size_t)&local_710,0x1c0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  miniminer_manual.m_ready_to_calculate = true;
  miniminer_manual._1_7_ = 0x322;
  CFeeRate::CFeeRate(&tx3_anc_feerate,(CAmount *)&miniminer_manual,
                     (int)(tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start[3] +
                          tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start[1]) +
                     (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start[2] +
                     (int)*tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start);
  miniminer_manual._0_8_ =
       CTxMemPool::GetEntry
                 (this_00,&(tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->hash);
  pcVar21 = "pool.GetEntry(tx3->GetHash())";
  ppCVar16 = inline_assertion_check<true,CTxMemPoolEntry_const*>
                       ((CTxMemPoolEntry **)&miniminer_manual,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
                        ,0x1c2,"test_method","pool.GetEntry(tx3->GetHash())");
  pCVar4 = *ppCVar16;
  local_728 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_720 = "";
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1c3;
  file_01.m_begin = (iterator)&local_728;
  msg_01.m_end = pvVar20;
  msg_01.m_begin = pcVar21;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_738,
             msg_01);
  bump_fees._M_t._M_impl._0_8_ = pCVar4->nModFeesWithAncestors;
  CFeeRate::CFeeRate((CFeeRate *)&descendant_caches,(CAmount *)&bump_fees,
                     (uint32_t)pCVar4->nSizeWithAncestors);
  miniminer_pool.m_ready_to_calculate =
       tx3_anc_feerate.nSatoshisPerK == descendant_caches._M_t._M_impl._0_8_;
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  mini_miner_tx6_tx7._0_8_ = anon_var_dwarf_90e19c;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
       (long)
       "tx3_anc_feerate == CFeeRate(tx3_entry.GetModFeesWithAncestors(), tx3_entry.GetSizeWithAncestors())"
       + 0x62;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
  miniminer_manual._0_8_ = &PTR__lazy_ostream_011481f0;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&mini_miner_tx6_tx7;
  local_748 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_740 = "";
  pvVar20 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&miniminer_pool,(lazy_ostream *)&miniminer_manual,1,0,WARN,_cVar34,
             (size_t)&local_748,0x1c3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  CFeeRate::CFeeRate(&tx4_feerate,&high_fee,
                     *(uint32_t *)
                      (tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start + 4));
  miniminer_manual.m_ready_to_calculate = true;
  miniminer_manual._1_7_ = 0x19c;
  CFeeRate::CFeeRate(&tx6_anc_feerate,(CAmount *)&miniminer_manual,
                     (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start[5] +
                     (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start[4] +
                     (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start[6]);
  miniminer_manual._0_8_ =
       CTxMemPool::GetEntry
                 (this_00,&(tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->hash);
  pcVar21 = "pool.GetEntry(tx6->GetHash())";
  ppCVar16 = inline_assertion_check<true,CTxMemPoolEntry_const*>
                       ((CTxMemPoolEntry **)&miniminer_manual,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
                        ,0x1c6,"test_method","pool.GetEntry(tx6->GetHash())");
  pCVar4 = *ppCVar16;
  local_768 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_760 = "";
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x1c7;
  file_02.m_begin = (iterator)&local_768;
  msg_02.m_end = pvVar20;
  msg_02.m_begin = pcVar21;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_778,
             msg_02);
  bump_fees._M_t._M_impl._0_8_ = pCVar4->nModFeesWithAncestors;
  CFeeRate::CFeeRate((CFeeRate *)&descendant_caches,(CAmount *)&bump_fees,
                     (uint32_t)pCVar4->nSizeWithAncestors);
  miniminer_pool.m_ready_to_calculate =
       tx6_anc_feerate.nSatoshisPerK == descendant_caches._M_t._M_impl._0_8_;
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  mini_miner_tx6_tx7._0_8_ = anon_var_dwarf_90e1c0;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
       (long)
       "tx6_anc_feerate == CFeeRate(tx6_entry.GetModFeesWithAncestors(), tx6_entry.GetSizeWithAncestors())"
       + 0x62;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
  miniminer_manual._0_8_ = &PTR__lazy_ostream_011481f0;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&mini_miner_tx6_tx7;
  local_788 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_780 = "";
  pvVar20 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&miniminer_pool,(lazy_ostream *)&miniminer_manual,1,0,WARN,_cVar34,
             (size_t)&local_788,0x1c7);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  miniminer_manual.m_ready_to_calculate = true;
  miniminer_manual._1_7_ = 0x30f;
  CFeeRate::CFeeRate(&tx7_anc_feerate,(CAmount *)&miniminer_manual,
                     (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start[5] +
                     (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start[4] +
                     (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start[7]);
  miniminer_manual._0_8_ =
       CTxMemPool::GetEntry
                 (this_00,&(tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->hash);
  pcVar21 = "pool.GetEntry(tx7->GetHash())";
  ppCVar16 = inline_assertion_check<true,CTxMemPoolEntry_const*>
                       ((CTxMemPoolEntry **)&miniminer_manual,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
                        ,0x1c9,"test_method","pool.GetEntry(tx7->GetHash())");
  pCVar4 = *ppCVar16;
  local_7a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_798 = "";
  local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x1ca;
  file_03.m_begin = (iterator)&local_7a0;
  msg_03.m_end = pvVar20;
  msg_03.m_begin = pcVar21;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_7b0,
             msg_03);
  bump_fees._M_t._M_impl._0_8_ = pCVar4->nModFeesWithAncestors;
  CFeeRate::CFeeRate((CFeeRate *)&descendant_caches,(CAmount *)&bump_fees,
                     (uint32_t)pCVar4->nSizeWithAncestors);
  miniminer_pool.m_ready_to_calculate =
       tx7_anc_feerate.nSatoshisPerK == descendant_caches._M_t._M_impl._0_8_;
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  mini_miner_tx6_tx7._0_8_ = anon_var_dwarf_90e1d8;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
       (long)
       "tx7_anc_feerate == CFeeRate(tx7_entry.GetModFeesWithAncestors(), tx7_entry.GetSizeWithAncestors())"
       + 0x62;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
  miniminer_manual._0_8_ = &PTR__lazy_ostream_011481f0;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&mini_miner_tx6_tx7;
  local_7c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_7b8 = "";
  pvVar20 = &DAT_00000001;
  pvVar22 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&miniminer_pool,(lazy_ostream *)&miniminer_manual,1,0,WARN,_cVar34,
             (size_t)&local_7c0,0x1ca);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  local_7d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_7c8 = "";
  local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x1cb;
  file_04.m_begin = (iterator)&local_7d0;
  msg_04.m_end = pvVar22;
  msg_04.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_7e0,
             msg_04);
  miniminer_pool.m_ready_to_calculate = tx6_anc_feerate.nSatoshisPerK < tx4_feerate.nSatoshisPerK;
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  mini_miner_tx6_tx7._0_8_ = anon_var_dwarf_90e1e4;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
       (long)"tx4_feerate > tx6_anc_feerate" + 0x1d;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
  miniminer_manual._0_8_ = &PTR__lazy_ostream_011481f0;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&mini_miner_tx6_tx7;
  local_7f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_7e8 = "";
  pvVar20 = &DAT_00000001;
  pvVar22 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&miniminer_pool,(lazy_ostream *)&miniminer_manual,1,0,WARN,_cVar34,
             (size_t)&local_7f0,0x1cb);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  local_800 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_7f8 = "";
  local_810 = &boost::unit_test::basic_cstring<char_const>::null;
  local_808 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x1cc;
  file_05.m_begin = (iterator)&local_800;
  msg_05.m_end = pvVar22;
  msg_05.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_810,
             msg_05);
  miniminer_pool.m_ready_to_calculate = tx7_anc_feerate.nSatoshisPerK < tx4_feerate.nSatoshisPerK;
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  mini_miner_tx6_tx7._0_8_ = anon_var_dwarf_90e1f0;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ = "";
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
  miniminer_manual._0_8_ = &PTR__lazy_ostream_011481f0;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&mini_miner_tx6_tx7;
  local_820 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_818 = "";
  pvVar20 = &DAT_00000001;
  pvVar22 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&miniminer_pool,(lazy_ostream *)&miniminer_manual,1,0,WARN,_cVar34,
             (size_t)&local_820,0x1cc);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  ::node::MiniMiner::MiniMiner(&miniminer_manual,this_00,&all_unspent_outpoints);
  very_high_feerate.nSatoshisPerK = 100000000;
  local_838 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_830 = "";
  local_848 = &boost::unit_test::basic_cstring<char_const>::null;
  local_840 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x1d2;
  file_06.m_begin = (iterator)&local_838;
  msg_06.m_end = pvVar22;
  msg_06.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_848,
             msg_06);
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  descendant_caches._M_t._M_impl._0_8_ = anon_var_dwarf_90e20a;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (long)"tx3_anc_feerate < very_high_feerate" + 0x23;
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  miniminer_pool._0_8_ = &PTR__lazy_ostream_011481f0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_858 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_850 = "";
  pvVar20 = &DAT_00000001;
  pvVar22 = (iterator)0x0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&descendant_caches;
  mini_miner_tx6_tx7.m_ready_to_calculate =
       tx3_anc_feerate.nSatoshisPerK < very_high_feerate.nSatoshisPerK;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&mini_miner_tx6_tx7,(lazy_ostream *)&miniminer_pool,1,0,WARN,
             _cVar34,(size_t)&local_858,0x1d2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header
            );
  local_868 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_860 = "";
  local_878 = &boost::unit_test::basic_cstring<char_const>::null;
  local_870 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x1d3;
  file_07.m_begin = (iterator)&local_868;
  msg_07.m_end = pvVar22;
  msg_07.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_878,
             msg_07);
  mini_miner_tx6_tx7.m_ready_to_calculate = miniminer_manual.m_ready_to_calculate;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  descendant_caches._M_t._M_impl._0_8_ = (long)"!mini_miner.IsReadyToCalculate()" + 1;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (long)"!mini_miner.IsReadyToCalculate()" + 0x20;
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  miniminer_pool._0_8_ = &PTR__lazy_ostream_011481f0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_888 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_880 = "";
  pvVar20 = &DAT_00000001;
  pvVar22 = (iterator)0x0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&descendant_caches;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&mini_miner_tx6_tx7,(lazy_ostream *)&miniminer_pool,1,0,WARN,
             _cVar34,(size_t)&local_888,0x1d3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header
            );
  ::node::MiniMiner::CalculateBumpFees(&bump_fees,&miniminer_manual,&very_high_feerate);
  local_898 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_890 = "";
  local_8a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x1d5;
  file_08.m_begin = (iterator)&local_898;
  msg_08.m_end = pvVar22;
  msg_08.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_8a8,
             msg_08);
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  miniminer_pool._0_8_ = &PTR__lazy_ostream_011480b0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0xc7f1cc;
  local_8b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_8b0 = "";
  pMVar23 = &mini_miner_tx6_tx7;
  mini_miner_tx6_tx7._0_8_ = bump_fees._M_t._M_impl.super__Rb_tree_header._M_node_count;
  descendant_caches._M_t._M_impl._0_8_ =
       ((long)all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
              _M_impl.super__Vector_impl_data._M_finish -
       (long)all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl
             .super__Vector_impl_data._M_start) / 0x24;
  pvVar20 = (iterator)0x2;
  p_Var30 = (_Base_ptr)&descendant_caches;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&miniminer_pool,&local_8b8,0x1d5,1,2,pMVar23,"bump_fees.size()",
             (_Base_ptr)&descendant_caches,"all_unspent_outpoints.size()");
  local_8c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_8c0 = "";
  local_8d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x1d6;
  file_09.m_begin = (iterator)&local_8c8;
  msg_09.m_end = &pMVar23->m_ready_to_calculate;
  msg_09.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_8d8,
             msg_09);
  mini_miner_tx6_tx7._0_8_ =
       CONCAT71(mini_miner_tx6_tx7._1_7_,miniminer_manual.m_ready_to_calculate) ^ 1;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  descendant_caches._M_t._M_impl._0_8_ = anon_var_dwarf_90df22;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (long)"!mini_miner.IsReadyToCalculate()" + 0x20;
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  miniminer_pool._0_8_ = &PTR__lazy_ostream_011481f0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_8e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_8e0 = "";
  pvVar20 = &DAT_00000001;
  pvVar22 = (iterator)0x0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&descendant_caches;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&mini_miner_tx6_tx7,(lazy_ostream *)&miniminer_pool,1,0,WARN,
             (check_type)p_Var30,(size_t)&local_8e8,0x1d6);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header
            );
  local_8f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_8f0 = "";
  local_908 = &boost::unit_test::basic_cstring<char_const>::null;
  local_900 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x1d7;
  file_10.m_begin = (iterator)&local_8f8;
  msg_10.m_end = pvVar22;
  msg_10.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_908,
             msg_10);
  bVar13 = sanity_check(&all_transactions,&bump_fees);
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  descendant_caches._M_t._M_impl._0_8_ = anon_var_dwarf_90df38;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (long)"sanity_check(all_transactions, bump_fees)" + 0x29;
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  miniminer_pool._0_8_ = &PTR__lazy_ostream_011481f0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_918 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_910 = "";
  pvVar20 = &DAT_00000001;
  pvVar22 = (iterator)0x0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&descendant_caches;
  mini_miner_tx6_tx7.m_ready_to_calculate = bVar13;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&mini_miner_tx6_tx7,(lazy_ostream *)&miniminer_pool,1,0,WARN,
             (check_type)p_Var30,(size_t)&local_918,0x1d7);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header
            );
  puVar10 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped;
  miniminer_pool.m_ready_to_calculate = (bool)(puVar10->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_pool._1_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_pool._2_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_pool._3_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_pool._4_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_pool._5_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_pool._6_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_pool._7_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[7];
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ =
       *(undefined1 (*) [16])
        (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 1;
  iVar17 = std::
           _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
           ::find(&bump_fees._M_t,(key_type *)&miniminer_pool);
  local_928 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_920 = "";
  local_938 = &boost::unit_test::basic_cstring<char_const>::null;
  local_930 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x1d9;
  file_11.m_begin = (iterator)&local_928;
  msg_11.m_end = pvVar22;
  msg_11.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_938,
             msg_11);
  p_Var1 = &bump_fees._M_t._M_impl.super__Rb_tree_header;
  pMVar23 = &mini_miner_tx6_tx7;
  mini_miner_tx6_tx7.m_ready_to_calculate = (_Rb_tree_header *)iVar17._M_node != p_Var1;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  descendant_caches._M_t._M_impl._0_8_ = anon_var_dwarf_90e216;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (long)"tx0_bumpfee != bump_fees.end()" + 0x1e;
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  miniminer_pool._0_8_ = &PTR__lazy_ostream_011481f0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_948 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_940 = "";
  pvVar20 = &DAT_00000001;
  pvVar22 = (iterator)0x0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&descendant_caches;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)pMVar23,(lazy_ostream *)&miniminer_pool,1,0,WARN,
             (check_type)p_Var30,(size_t)&local_948,0x1d9);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header
            );
  local_958 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_950 = "";
  local_968 = &boost::unit_test::basic_cstring<char_const>::null;
  local_960 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x1da;
  file_12.m_begin = (iterator)&local_958;
  msg_12.m_end = pvVar22;
  msg_12.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_968,
             msg_12);
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  miniminer_pool._0_8_ = &PTR__lazy_ostream_011480b0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0xc7f1cc;
  local_978 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_970 = "";
  CVar18 = CFeeRate::GetFee(&very_high_feerate,
                            (uint32_t)
                            *tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_start);
  pp_Var24 = &iVar17._M_node[2]._M_parent;
  mini_miner_tx6_tx7._0_8_ = CVar18 + -500;
  pvVar20 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&miniminer_pool,&local_978,0x1da,1,2,pp_Var24,"tx0_bumpfee->second",pMVar23,
             "very_high_feerate.GetFee(tx_vsizes[0]) - low_fee");
  puVar10 = &((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped;
  miniminer_pool.m_ready_to_calculate = (bool)(puVar10->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_pool._1_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_pool._2_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_pool._3_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_pool._4_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_pool._5_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_pool._6_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_pool._7_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[7];
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ =
       *(undefined1 (*) [16])
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  iVar17 = std::
           _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
           ::find(&bump_fees._M_t,(key_type *)&miniminer_pool);
  local_988 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_980 = "";
  local_998 = &boost::unit_test::basic_cstring<char_const>::null;
  local_990 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x1dc;
  file_13.m_begin = (iterator)&local_988;
  msg_13.m_end = (iterator)pp_Var24;
  msg_13.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_998,
             msg_13);
  pMVar31 = &mini_miner_tx6_tx7;
  mini_miner_tx6_tx7.m_ready_to_calculate = (_Rb_tree_header *)iVar17._M_node != p_Var1;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  descendant_caches._M_t._M_impl._0_8_ = anon_var_dwarf_90e252;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (long)"tx3_bumpfee != bump_fees.end()" + 0x1e;
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  miniminer_pool._0_8_ = &PTR__lazy_ostream_011481f0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_9a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_9a0 = "";
  pvVar20 = &DAT_00000001;
  pvVar22 = (iterator)0x0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&descendant_caches;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)pMVar31,(lazy_ostream *)&miniminer_pool,1,0,WARN,
             (check_type)pMVar23,(size_t)&local_9a8,0x1dc);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header
            );
  local_9b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_9b0 = "";
  local_9c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x1de;
  file_14.m_begin = (iterator)&local_9b8;
  msg_14.m_end = pvVar22;
  msg_14.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_9c8,
             msg_14);
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  miniminer_pool._0_8_ = &PTR__lazy_ostream_011480b0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0xc7f1cc;
  local_9d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_9d0 = "";
  CVar18 = CFeeRate::GetFee(&very_high_feerate,
                            (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start[1] +
                            (int)*tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_start +
                            (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start[2] +
                            (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start[3]);
  pp_Var24 = &iVar17._M_node[2]._M_parent;
  mini_miner_tx6_tx7._0_8_ = CVar18 + -0x322bc;
  pvVar20 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&miniminer_pool,&local_9d8,0x1de,1,2,pp_Var24,"tx3_bumpfee->second",pMVar31,
             "very_high_feerate.GetFee(tx_vsizes[0] + tx_vsizes[1] + tx_vsizes[2] + tx_vsizes[3]) - (low_fee + med_fee + high_fee + high_fee)"
            );
  puVar10 = &((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped;
  miniminer_pool.m_ready_to_calculate = (bool)(puVar10->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_pool._1_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_pool._2_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_pool._3_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_pool._4_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_pool._5_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_pool._6_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_pool._7_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[7];
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ =
       *(undefined1 (*) [16])
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  iVar17 = std::
           _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
           ::find(&bump_fees._M_t,(key_type *)&miniminer_pool);
  local_9e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_9e0 = "";
  local_9f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x1e0;
  file_15.m_begin = (iterator)&local_9e8;
  msg_15.m_end = (iterator)pp_Var24;
  msg_15.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_9f8,
             msg_15);
  pMVar23 = &mini_miner_tx6_tx7;
  mini_miner_tx6_tx7.m_ready_to_calculate = (_Rb_tree_header *)iVar17._M_node != p_Var1;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  descendant_caches._M_t._M_impl._0_8_ = anon_var_dwarf_90e282;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (long)"tx6_bumpfee != bump_fees.end()" + 0x1e;
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  miniminer_pool._0_8_ = &PTR__lazy_ostream_011481f0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_a08 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_a00 = "";
  pvVar20 = &DAT_00000001;
  pvVar22 = (iterator)0x0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&descendant_caches;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)pMVar23,(lazy_ostream *)&miniminer_pool,1,0,WARN,
             (check_type)pMVar31,(size_t)&local_a08,0x1e0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header
            );
  local_a18 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_a10 = "";
  local_a28 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a20 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x1e2;
  file_16.m_begin = (iterator)&local_a18;
  msg_16.m_end = pvVar22;
  msg_16.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_a28,
             msg_16);
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  miniminer_pool._0_8_ = &PTR__lazy_ostream_011480b0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0xc7f1cc;
  local_a38 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_a30 = "";
  CVar18 = CFeeRate::GetFee(&very_high_feerate,
                            (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start[5] +
                            (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start[4] +
                            (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start[6]);
  pp_Var24 = &iVar17._M_node[2]._M_parent;
  mini_miner_tx6_tx7._0_8_ = CVar18 + -0x19c1c;
  pvVar20 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&miniminer_pool,&local_a38,0x1e2,1,2,pp_Var24,"tx6_bumpfee->second",pMVar23,
             "very_high_feerate.GetFee(tx_vsizes[4] + tx_vsizes[5] + tx_vsizes[6]) - (high_fee + low_fee + med_fee)"
            );
  puVar10 = &((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped;
  miniminer_pool.m_ready_to_calculate = (bool)(puVar10->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_pool._1_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_pool._2_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_pool._3_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_pool._4_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_pool._5_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_pool._6_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_pool._7_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[7];
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ =
       *(undefined1 (*) [16])
        (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  iVar17 = std::
           _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
           ::find(&bump_fees._M_t,(key_type *)&miniminer_pool);
  local_a48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_a40 = "";
  local_a58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a50 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x1e4;
  file_17.m_begin = (iterator)&local_a48;
  msg_17.m_end = (iterator)pp_Var24;
  msg_17.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_a58,
             msg_17);
  pMVar31 = &mini_miner_tx6_tx7;
  mini_miner_tx6_tx7.m_ready_to_calculate = (_Rb_tree_header *)iVar17._M_node != p_Var1;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  descendant_caches._M_t._M_impl._0_8_ = anon_var_dwarf_90e2b2;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = "";
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  miniminer_pool._0_8_ = &PTR__lazy_ostream_011481f0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_a68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_a60 = "";
  pvVar20 = &DAT_00000001;
  pvVar22 = (iterator)0x0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&descendant_caches;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)pMVar31,(lazy_ostream *)&miniminer_pool,1,0,WARN,
             (check_type)pMVar23,(size_t)&local_a68,0x1e4);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header
            );
  local_a78 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_a70 = "";
  local_a88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a80 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x1e6;
  file_18.m_begin = (iterator)&local_a78;
  msg_18.m_end = pvVar22;
  msg_18.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_a88,
             msg_18);
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  miniminer_pool._0_8_ = &PTR__lazy_ostream_011480b0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0xc7f1cc;
  local_a98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_a90 = "";
  CVar18 = CFeeRate::GetFee(&very_high_feerate,
                            (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start[5] +
                            (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start[4] +
                            (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start[7]);
  pp_Var24 = &iVar17._M_node[2]._M_parent;
  mini_miner_tx6_tx7._0_8_ = CVar18 + -0x30f34;
  pvVar20 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&miniminer_pool,&local_a98,0x1e6,1,2,pp_Var24,"tx7_bumpfee->second",pMVar31,
             "very_high_feerate.GetFee(tx_vsizes[4] + tx_vsizes[5] + tx_vsizes[7]) - (high_fee + low_fee + high_fee)"
            );
  puVar10 = &((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped;
  mini_miner_tx6_tx7.m_ready_to_calculate =
       (bool)(puVar10->super_base_blob<256U>).m_data._M_elems[0];
  mini_miner_tx6_tx7._1_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[1];
  mini_miner_tx6_tx7._2_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[2];
  mini_miner_tx6_tx7._3_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[3];
  mini_miner_tx6_tx7._4_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[4];
  mini_miner_tx6_tx7._5_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[5];
  mini_miner_tx6_tx7._6_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[6];
  mini_miner_tx6_tx7._7_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[7];
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ =
       *(undefined1 (*) [16])
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0
  ;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._20_8_ =
       *(undefined8 *)
        ((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._28_8_ =
       *(undefined8 *)
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  mini_miner_tx6_tx7._52_8_ =
       *(undefined8 *)
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  mini_miner_tx6_tx7.m_requested_outpoints_by_txid._M_t._M_impl._4_8_ =
       *(undefined8 *)
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  mini_miner_tx6_tx7.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _4_4_ = 1;
  __l_09._M_len = 2;
  __l_09._M_array = (iterator)&mini_miner_tx6_tx7;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&descendant_caches,__l_09,
             (allocator_type *)&miniminer_info);
  ::node::MiniMiner::MiniMiner
            (&miniminer_pool,this_00,
             (vector<COutPoint,_std::allocator<COutPoint>_> *)&descendant_caches);
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)&descendant_caches);
  local_aa8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_aa0 = "";
  local_ab8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ab0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x1e9;
  file_19.m_begin = (iterator)&local_aa8;
  msg_19.m_end = (iterator)pp_Var24;
  msg_19.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_ab8,
             msg_19);
  descendant_caches._M_t._M_impl._0_1_ = miniminer_pool.m_ready_to_calculate;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  miniminer_info.
  super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = 100;
  miniminer_info.
  super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
  _M_impl.super__Vector_impl_data._M_start._1_7_ = 0xbb64;
  miniminer_info.
  super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0x8d;
  miniminer_info.
  super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0xbb64;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
       mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_011481f0;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_ac8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_ac0 = "";
  pvVar20 = &DAT_00000001;
  pvVar22 = (iterator)0x0;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&miniminer_info;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&descendant_caches,(lazy_ostream *)&mini_miner_tx6_tx7,1,0,WARN,
             (check_type)pMVar31,(size_t)&local_ac8,0x1e9);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  oVar29 = ::node::MiniMiner::CalculateTotalBumpFees(&miniminer_pool,&very_high_feerate);
  tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value =
       oVar29.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_payload;
  tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_engaged = oVar29.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_engaged;
  local_ad8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_ad0 = "";
  local_ae8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ae0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x1eb;
  file_20.m_begin = (iterator)&local_ad8;
  msg_20.m_end = pvVar22;
  msg_20.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_ae8,
             msg_20);
  descendant_caches._M_t._M_impl._0_1_ = miniminer_pool.m_ready_to_calculate ^ 1;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  miniminer_info.
  super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = 99;
  miniminer_info.
  super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
  _M_impl.super__Vector_impl_data._M_start._1_7_ = 0xbb64;
  miniminer_info.
  super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0x8d;
  miniminer_info.
  super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0xbb64;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
       mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_011481f0;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_af8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_af0 = "";
  pvVar20 = &DAT_00000001;
  pvVar22 = (iterator)0x0;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&miniminer_info;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&descendant_caches,(lazy_ostream *)&mini_miner_tx6_tx7,1,0,WARN,
             (check_type)pMVar31,(size_t)&local_af8,0x1eb);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  local_b08 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_b00 = "";
  local_b18 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b10 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x1ec;
  file_21.m_begin = (iterator)&local_b08;
  msg_21.m_end = pvVar22;
  msg_21.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_b18,
             msg_21);
  paVar32 = (assertion_result *)&descendant_caches;
  descendant_caches._M_t._M_impl._0_1_ =
       tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._M_engaged;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  miniminer_info.
  super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = 0x8e;
  miniminer_info.
  super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
  _M_impl.super__Vector_impl_data._M_start._1_7_ = 0xbb64;
  miniminer_info.
  super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_1_ = -0x5a;
  miniminer_info.
  super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0xbb64;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
       mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_011481f0;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_b28 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_b20 = "";
  pvVar20 = &DAT_00000001;
  pvVar22 = (iterator)0x0;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&miniminer_info;
  boost::test_tools::tt_detail::report_assertion
            (paVar32,(lazy_ostream *)&mini_miner_tx6_tx7,1,0,WARN,(check_type)pMVar31,
             (size_t)&local_b28,0x1ec);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  local_b38 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_b30 = "";
  local_b48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b40 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x1ee;
  file_22.m_begin = (iterator)&local_b38;
  msg_22.m_end = pvVar22;
  msg_22.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_b48,
             msg_22);
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
       mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_011480b0;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0xc7f1cc;
  local_b58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_b50 = "";
  if (tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_engaged == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    CVar18 = CFeeRate::GetFee(&very_high_feerate,
                              (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl
                                   .super__Vector_impl_data._M_start[1] +
                              (int)*tx_vsizes.super__Vector_base<long,_std::allocator<long>_>.
                                    _M_impl.super__Vector_impl_data._M_start +
                              (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl
                                   .super__Vector_impl_data._M_start[2] +
                              (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl
                                   .super__Vector_impl_data._M_start[3]);
    descendant_caches._M_t._M_impl._0_8_ = CVar18 + -0x322bc;
    pvVar20 = (iterator)0x2;
    poVar27 = &tx3_bump_fee;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&mini_miner_tx6_tx7,&local_b58,0x1ee,1,2,poVar27,"tx3_bump_fee.value()",paVar32,
               "very_high_feerate.GetFee(tx_vsizes[0] + tx_vsizes[1] + tx_vsizes[2] + tx_vsizes[3]) - (low_fee + med_fee + high_fee + high_fee)"
              );
    puVar10 = &((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped;
    descendant_caches._M_t._M_impl._0_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[0];
    descendant_caches._M_t._M_impl._1_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[1];
    descendant_caches._M_t._M_impl._2_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[2];
    descendant_caches._M_t._M_impl._3_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[3];
    descendant_caches._M_t._M_impl._4_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[4];
    descendant_caches._M_t._M_impl._5_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[5];
    descendant_caches._M_t._M_impl._6_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[6];
    descendant_caches._M_t._M_impl._7_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[7];
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_16_ =
         *(undefined1 (*) [16])
          (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
           m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         *(_Base_ptr *)
          (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
           m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ = 0;
    uVar6 = *(undefined8 *)
             ((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems;
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ =
         (undefined4)uVar6;
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
         (undefined4)((ulong)uVar6 >> 0x20);
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
         (undefined4)
         *(undefined8 *)
          (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
           m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    __l_10._M_len = 2;
    __l_10._M_array = (iterator)&descendant_caches;
    std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
              ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_info,__l_10,
               (allocator_type *)&tx6_tx7_bumpfee);
    ::node::MiniMiner::MiniMiner
              (&mini_miner_tx6_tx7,this_00,
               (vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_info);
    std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
              ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_info);
    local_b68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
    ;
    local_b60 = "";
    local_b78 = &boost::unit_test::basic_cstring<char_const>::null;
    local_b70 = &boost::unit_test::basic_cstring<char_const>::null;
    file_23.m_end = (iterator)0x1f1;
    file_23.m_begin = (iterator)&local_b68;
    msg_23.m_end = (iterator)poVar27;
    msg_23.m_begin = pvVar20;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_b78,
               msg_23);
    miniminer_info.
    super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
    _M_impl.super__Vector_impl_data._M_start._0_1_ = mini_miner_tx6_tx7.m_ready_to_calculate;
    miniminer_info.
    super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    miniminer_info.
    super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    miniminer_info.
    super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_payload._M_value =
         (long)"!mini_miner_tx6_tx7.IsReadyToCalculate()" + 1;
    tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._8_8_ =
         (long)"!mini_miner_tx6_tx7.IsReadyToCalculate()" + 0x28;
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
    descendant_caches._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011481f0;
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_b88 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
    ;
    local_b80 = "";
    pvVar20 = &DAT_00000001;
    pvVar22 = (iterator)0x0;
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)&tx6_tx7_bumpfee;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&miniminer_info,(lazy_ostream *)&descendant_caches,1,0,WARN,
               (check_type)paVar32,(size_t)&local_b88,0x1f1);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &miniminer_info.
                super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    oVar29 = ::node::MiniMiner::CalculateTotalBumpFees(&mini_miner_tx6_tx7,&very_high_feerate);
    tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_payload._M_value =
         oVar29.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
         ._M_payload;
    tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_engaged =
         oVar29.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
         ._M_engaged;
    local_b98 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
    ;
    local_b90 = "";
    local_ba8 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
    local_ba0 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
    file_24.m_end = (iterator)0x1f3;
    file_24.m_begin = (iterator)&local_b98;
    msg_24.m_end = pvVar22;
    msg_24.m_begin = pvVar20;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_ba8,
               msg_24);
    miniminer_info.
    super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
    _M_impl.super__Vector_impl_data._M_start._0_1_ = mini_miner_tx6_tx7.m_ready_to_calculate ^ 1;
    miniminer_info.
    super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    miniminer_info.
    super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    miniminer_info.
    super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_bb8 = "!mini_miner_tx6_tx7.IsReadyToCalculate()";
    local_bb0 = (_Base_ptr)0xbb64e4;
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
    descendant_caches._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011481f0;
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_bc8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
    ;
    local_bc0 = "";
    pvVar20 = &DAT_00000001;
    pvVar22 = (iterator)0x0;
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_bb8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&miniminer_info,(lazy_ostream *)&descendant_caches,1,0,WARN,
               (check_type)paVar32,(size_t)&local_bc8,499);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &miniminer_info.
                super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_bd8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
    ;
    local_bd0 = "";
    local_be8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_be0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_25.m_end = (iterator)0x1f4;
    file_25.m_begin = (iterator)&local_bd8;
    msg_25.m_end = pvVar22;
    msg_25.m_begin = pvVar20;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_be8,
               msg_25);
    paVar33 = (assertion_result *)&miniminer_info;
    miniminer_info.
    super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
    _M_impl.super__Vector_impl_data._M_start._0_1_ =
         tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
         super__Optional_payload_base<long>._M_engaged;
    miniminer_info.
    super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_1_ = '\0';
    miniminer_info.
    super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    miniminer_info.
    super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_bb8 = "tx6_tx7_bumpfee.has_value()";
    local_bb0 = (_Base_ptr)0xbb6500;
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
    descendant_caches._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011481f0;
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_bf8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
    ;
    local_bf0 = "";
    pvVar20 = &DAT_00000001;
    pvVar22 = (iterator)0x0;
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_bb8;
    boost::test_tools::tt_detail::report_assertion
              (paVar33,(lazy_ostream *)&descendant_caches,1,0,WARN,(check_type)paVar32,
               (size_t)&local_bf8,500);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &miniminer_info.
                super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_c08 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
    ;
    local_c00 = "";
    local_c18 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c10 = &boost::unit_test::basic_cstring<char_const>::null;
    file_26.m_end = (iterator)0x1f6;
    file_26.m_begin = (iterator)&local_c08;
    msg_26.m_end = pvVar22;
    msg_26.m_begin = pvVar20;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_c18,
               msg_26);
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
    descendant_caches._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011480b0;
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc7f1cc;
    local_c28 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
    ;
    local_c20 = "";
    if (tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged == false) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      CVar18 = CFeeRate::GetFee(&very_high_feerate,
                                (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>.
                                     _M_impl.super__Vector_impl_data._M_start[5] +
                                (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>.
                                     _M_impl.super__Vector_impl_data._M_start[4] +
                                (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>.
                                     _M_impl.super__Vector_impl_data._M_start[6] +
                                (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>.
                                     _M_impl.super__Vector_impl_data._M_start[7]);
      miniminer_info.
      super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
      _M_impl.super__Vector_impl_data._M_start._0_1_ = (byte)(CVar18 + -0x322bc);
      miniminer_info.
      super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
      _M_impl.super__Vector_impl_data._M_start._1_7_ = (undefined7)((ulong)(CVar18 + -0x322bc) >> 8)
      ;
      pvVar20 = (iterator)0x2;
      poVar27 = &tx6_tx7_bumpfee;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                ((_Base_ptr)&descendant_caches,&local_c28,0x1f6,1,2,poVar27,
                 "tx6_tx7_bumpfee.value()",paVar33,
                 "very_high_feerate.GetFee(tx_vsizes[4] + tx_vsizes[5] + tx_vsizes[6] + tx_vsizes[7]) - (high_fee + low_fee + med_fee + high_fee)"
                );
      ::node::MiniMiner::~MiniMiner(&mini_miner_tx6_tx7);
      ::node::MiniMiner::~MiniMiner(&miniminer_pool);
      std::
      _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
      ::~_Rb_tree((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                   *)&bump_fees);
      ::node::MiniMiner::~MiniMiner(&miniminer_manual);
      tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_payload._M_value = tx4_feerate.nSatoshisPerK + -5;
      ::node::MiniMiner::MiniMiner(&miniminer_manual,this_00,&all_unspent_outpoints);
      local_c38 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_c30 = "";
      local_c48 = &boost::unit_test::basic_cstring<char_const>::null;
      local_c40 = &boost::unit_test::basic_cstring<char_const>::null;
      file_27.m_end = (iterator)0x1fc;
      file_27.m_begin = (iterator)&local_c38;
      msg_27.m_end = (iterator)poVar27;
      msg_27.m_begin = pvVar20;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_c48,
                 msg_27);
      mini_miner_tx6_tx7.m_ready_to_calculate = miniminer_manual.m_ready_to_calculate;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
      descendant_caches._M_t._M_impl._0_8_ = (long)"!mini_miner.IsReadyToCalculate()" + 1;
      descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           (long)"!mini_miner.IsReadyToCalculate()" + 0x20;
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
           miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
      miniminer_pool._0_8_ = &PTR__lazy_ostream_011481f0;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      local_c58 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_c50 = "";
      pvVar20 = &DAT_00000001;
      pvVar22 = (iterator)0x0;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&descendant_caches;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&mini_miner_tx6_tx7,(lazy_ostream *)&miniminer_pool,1,0,WARN,
                 (check_type)paVar33,(size_t)&local_c58,0x1fc);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
      ::node::MiniMiner::CalculateBumpFees
                ((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                  *)&descendant_caches,&miniminer_manual,(CFeeRate *)&tx6_tx7_bumpfee);
      local_c68 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_c60 = "";
      local_c78 = &boost::unit_test::basic_cstring<char_const>::null;
      local_c70 = &boost::unit_test::basic_cstring<char_const>::null;
      file_28.m_end = (iterator)0x1fe;
      file_28.m_begin = (iterator)&local_c68;
      msg_28.m_end = pvVar22;
      msg_28.m_begin = pvVar20;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_c78,
                 msg_28);
      mini_miner_tx6_tx7._0_8_ =
           CONCAT71(mini_miner_tx6_tx7._1_7_,miniminer_manual.m_ready_to_calculate) ^ 1;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
      bump_fees._M_t._M_impl._0_8_ = anon_var_dwarf_90df22;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           (long)"!mini_miner.IsReadyToCalculate()" + 0x20;
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
           miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
      miniminer_pool._0_8_ = &PTR__lazy_ostream_011481f0;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      local_c88 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_c80 = "";
      pvVar20 = &DAT_00000001;
      pvVar22 = (iterator)0x0;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&bump_fees;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&mini_miner_tx6_tx7,(lazy_ostream *)&miniminer_pool,1,0,WARN,
                 (check_type)paVar33,(size_t)&local_c88,0x1fe);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
      local_c98 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_c90 = "";
      local_ca8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_ca0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_29.m_end = (iterator)0x1ff;
      file_29.m_begin = (iterator)&local_c98;
      msg_29.m_end = pvVar22;
      msg_29.m_begin = pvVar20;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_ca8,
                 msg_29);
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
           miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
      miniminer_pool._0_8_ = &PTR__lazy_ostream_011480b0;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0xc7f1cc;
      local_cb8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_cb0 = "";
      mini_miner_tx6_tx7._4_4_ =
           descendant_caches._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
      mini_miner_tx6_tx7._0_4_ =
           (undefined4)descendant_caches._M_t._M_impl.super__Rb_tree_header._M_node_count;
      pMVar23 = &mini_miner_tx6_tx7;
      bump_fees._M_t._M_impl._0_8_ =
           ((long)all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x24;
      pvVar20 = (iterator)0x2;
      p_Var30 = (_Base_ptr)&bump_fees;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                (&miniminer_pool,&local_cb8,0x1ff,1,2,pMVar23,"bump_fees.size()",
                 (_Base_ptr)&bump_fees,"all_unspent_outpoints.size()");
      local_cc8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_cc0 = "";
      local_cd8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_cd0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_30.m_end = (iterator)0x200;
      file_30.m_begin = (iterator)&local_cc8;
      msg_30.m_end = &pMVar23->m_ready_to_calculate;
      msg_30.m_begin = pvVar20;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_cd8,
                 msg_30);
      bVar13 = sanity_check(&all_transactions,
                            (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                             *)&descendant_caches);
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
      bump_fees._M_t._M_impl._0_8_ = anon_var_dwarf_90df38;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           (long)"sanity_check(all_transactions, bump_fees)" + 0x29;
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
           miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
      miniminer_pool._0_8_ = &PTR__lazy_ostream_011481f0;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      local_ce8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_ce0 = "";
      pvVar20 = &DAT_00000001;
      pvVar22 = (iterator)0x0;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&bump_fees;
      mini_miner_tx6_tx7.m_ready_to_calculate = bVar13;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&mini_miner_tx6_tx7,(lazy_ostream *)&miniminer_pool,1,0,WARN,
                 (check_type)p_Var30,(size_t)&local_ce8,0x200);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
      puVar10 = &((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped;
      miniminer_pool.m_ready_to_calculate =
           (bool)(puVar10->super_base_blob<256U>).m_data._M_elems[0];
      miniminer_pool._1_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[1];
      miniminer_pool._2_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[2];
      miniminer_pool._3_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[3];
      miniminer_pool._4_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[4];
      miniminer_pool._5_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[5];
      miniminer_pool._6_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[6];
      miniminer_pool._7_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[7];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ =
           *(undefined1 (*) [16])
            (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0
      ;
      iVar17 = std::
               _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
               ::find((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                       *)&descendant_caches,(key_type *)&miniminer_pool);
      local_cf8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_cf0 = "";
      local_d08 = &boost::unit_test::basic_cstring<char_const>::null;
      local_d00 = &boost::unit_test::basic_cstring<char_const>::null;
      file_31.m_end = (iterator)0x202;
      file_31.m_begin = (iterator)&local_cf8;
      msg_31.m_end = pvVar22;
      msg_31.m_begin = pvVar20;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_d08,
                 msg_31);
      pMVar23 = &mini_miner_tx6_tx7;
      mini_miner_tx6_tx7.m_ready_to_calculate =
           (_Rb_tree_header *)iVar17._M_node !=
           &descendant_caches._M_t._M_impl.super__Rb_tree_header;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
      bump_fees._M_t._M_impl._0_8_ = anon_var_dwarf_90e282;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           (long)"tx6_bumpfee != bump_fees.end()" + 0x1e;
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
           miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
      miniminer_pool._0_8_ = &PTR__lazy_ostream_011481f0;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      local_d18 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_d10 = "";
      pvVar20 = &DAT_00000001;
      pvVar22 = (iterator)0x0;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&bump_fees;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)pMVar23,(lazy_ostream *)&miniminer_pool,1,0,WARN,
                 (check_type)p_Var30,(size_t)&local_d18,0x202);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
      local_d28 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_d20 = "";
      local_d38 = &boost::unit_test::basic_cstring<char_const>::null;
      local_d30 = &boost::unit_test::basic_cstring<char_const>::null;
      file_32.m_end = (iterator)0x203;
      file_32.m_begin = (iterator)&local_d28;
      msg_32.m_end = pvVar22;
      msg_32.m_begin = pvVar20;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_d38,
                 msg_32);
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
           miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
      miniminer_pool._0_8_ = &PTR__lazy_ostream_011480b0;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0xc7f1cc;
      local_d48 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_d40 = "";
      CVar18 = CFeeRate::GetFee((CFeeRate *)&tx6_tx7_bumpfee,
                                (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>.
                                     _M_impl.super__Vector_impl_data._M_start[6] +
                                (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>.
                                     _M_impl.super__Vector_impl_data._M_start[5]);
      pp_Var24 = &iVar17._M_node[2]._M_parent;
      mini_miner_tx6_tx7._0_8_ = CVar18 + -0x157c;
      pvVar20 = (iterator)0x2;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (&miniminer_pool,&local_d48,0x203,1,2,pp_Var24,"tx6_bumpfee->second",pMVar23,
                 "just_below_tx4.GetFee(tx_vsizes[5] + tx_vsizes[6]) - (low_fee + med_fee)");
      puVar10 = &((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped;
      miniminer_pool.m_ready_to_calculate =
           (bool)(puVar10->super_base_blob<256U>).m_data._M_elems[0];
      miniminer_pool._1_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[1];
      miniminer_pool._2_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[2];
      miniminer_pool._3_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[3];
      miniminer_pool._4_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[4];
      miniminer_pool._5_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[5];
      miniminer_pool._6_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[6];
      miniminer_pool._7_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[7];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ =
           *(undefined1 (*) [16])
            (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0
      ;
      iVar17 = std::
               _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
               ::find((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                       *)&descendant_caches,(key_type *)&miniminer_pool);
      local_d58 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_d50 = "";
      local_d68 = &boost::unit_test::basic_cstring<char_const>::null;
      local_d60 = &boost::unit_test::basic_cstring<char_const>::null;
      file_33.m_end = (iterator)0x205;
      file_33.m_begin = (iterator)&local_d58;
      msg_33.m_end = (iterator)pp_Var24;
      msg_33.m_begin = pvVar20;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_d68,
                 msg_33);
      pMVar31 = &mini_miner_tx6_tx7;
      mini_miner_tx6_tx7.m_ready_to_calculate =
           (_Rb_tree_header *)iVar17._M_node !=
           &descendant_caches._M_t._M_impl.super__Rb_tree_header;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
      bump_fees._M_t._M_impl._0_8_ = anon_var_dwarf_90e2b2;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = "";
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
           miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
      miniminer_pool._0_8_ = &PTR__lazy_ostream_011481f0;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      local_d78 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_d70 = "";
      pvVar20 = &DAT_00000001;
      pvVar22 = (iterator)0x0;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&bump_fees;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)pMVar31,(lazy_ostream *)&miniminer_pool,1,0,WARN,
                 (check_type)pMVar23,(size_t)&local_d78,0x205);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
      local_d88 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_d80 = "";
      local_d98 = &boost::unit_test::basic_cstring<char_const>::null;
      local_d90 = &boost::unit_test::basic_cstring<char_const>::null;
      file_34.m_end = (iterator)0x206;
      file_34.m_begin = (iterator)&local_d88;
      msg_34.m_end = pvVar22;
      msg_34.m_begin = pvVar20;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_d98,
                 msg_34);
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
           miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
      miniminer_pool._0_8_ = &PTR__lazy_ostream_011480b0;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0xc7f1cc;
      local_da8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_da0 = "";
      CVar18 = CFeeRate::GetFee((CFeeRate *)&tx6_tx7_bumpfee,
                                (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>.
                                     _M_impl.super__Vector_impl_data._M_start[7] +
                                (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>.
                                     _M_impl.super__Vector_impl_data._M_start[5]);
      pp_Var24 = &iVar17._M_node[2]._M_parent;
      mini_miner_tx6_tx7._0_8_ = CVar18 + -0x18894;
      pvVar20 = (iterator)0x2;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (&miniminer_pool,&local_da8,0x206,1,2,pp_Var24,"tx7_bumpfee->second",pMVar31,
                 "just_below_tx4.GetFee(tx_vsizes[5] + tx_vsizes[7]) - (low_fee + high_fee)");
      puVar10 = &((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped;
      mini_miner_tx6_tx7.m_ready_to_calculate =
           (bool)(puVar10->super_base_blob<256U>).m_data._M_elems[0];
      mini_miner_tx6_tx7._1_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[1];
      mini_miner_tx6_tx7._2_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[2];
      mini_miner_tx6_tx7._3_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[3];
      mini_miner_tx6_tx7._4_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[4];
      mini_miner_tx6_tx7._5_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[5];
      mini_miner_tx6_tx7._6_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[6];
      mini_miner_tx6_tx7._7_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[7];
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ =
           *(undefined1 (*) [16])
            (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_
           = 0;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._20_8_ =
           *(undefined8 *)
            ((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._28_8_ =
           *(undefined8 *)
            (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      mini_miner_tx6_tx7._52_8_ =
           *(undefined8 *)
            (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      mini_miner_tx6_tx7.m_requested_outpoints_by_txid._M_t._M_impl._4_8_ =
           *(undefined8 *)
            (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      mini_miner_tx6_tx7.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _4_4_ = 0;
      __l_11._M_len = 2;
      __l_11._M_array = (iterator)&mini_miner_tx6_tx7;
      std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
                ((vector<COutPoint,_std::allocator<COutPoint>_> *)&bump_fees,__l_11,
                 (allocator_type *)&miniminer_info);
      ::node::MiniMiner::MiniMiner
                (&miniminer_pool,this_00,(vector<COutPoint,_std::allocator<COutPoint>_> *)&bump_fees
                );
      std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
                ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)&bump_fees);
      local_db8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_db0 = "";
      local_dc8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_dc0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_35.m_end = (iterator)0x209;
      file_35.m_begin = (iterator)&local_db8;
      msg_35.m_end = (iterator)pp_Var24;
      msg_35.m_begin = pvVar20;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_dc8,
                 msg_35);
      bump_fees._M_t._M_impl._0_1_ = miniminer_pool.m_ready_to_calculate;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      miniminer_info.
      super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
      _M_impl.super__Vector_impl_data._M_start._0_1_ = 0xbd;
      miniminer_info.
      super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
      _M_impl.super__Vector_impl_data._M_start._1_7_ = 0xbb64;
      miniminer_info.
      super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0xe4;
      miniminer_info.
      super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0xbb64;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
           mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
      mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_011481f0;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      local_dd8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_dd0 = "";
      pvVar20 = &DAT_00000001;
      pvVar22 = (iterator)0x0;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&miniminer_info;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&bump_fees,(lazy_ostream *)&mini_miner_tx6_tx7,1,0,WARN,
                 (check_type)pMVar31,(size_t)&local_dd8,0x209);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      oVar29 = ::node::MiniMiner::CalculateTotalBumpFees
                         (&miniminer_pool,(CFeeRate *)&tx6_tx7_bumpfee);
      miniminer_info.
      super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
      _M_impl.super__Vector_impl_data._M_start._0_1_ =
           oVar29.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload._0_1_;
      miniminer_info.
      super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
      _M_impl.super__Vector_impl_data._M_start._1_7_ =
           oVar29.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload._1_7_;
      miniminer_info.
      super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_1_ =
           oVar29.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_engaged;
      local_de8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_de0 = "";
      local_df8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_df0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_36.m_end = (iterator)0x20b;
      file_36.m_begin = (iterator)&local_de8;
      msg_36.m_end = pvVar22;
      msg_36.m_begin = pvVar20;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_df8,
                 msg_36);
      bump_fees._M_t._M_impl._0_1_ = miniminer_pool.m_ready_to_calculate ^ 1;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_payload._M_value = (long)anon_var_dwarf_90e336;
      tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._8_8_ =
           (long)"!mini_miner_tx6_tx7.IsReadyToCalculate()" + 0x28;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
           mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
      mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_011481f0;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      local_e08 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_e00 = "";
      pvVar20 = &DAT_00000001;
      pvVar22 = (iterator)0x0;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&tx3_bump_fee;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&bump_fees,(lazy_ostream *)&mini_miner_tx6_tx7,1,0,WARN,
                 (check_type)pMVar31,(size_t)&local_e08,0x20b);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      local_e18 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_e10 = "";
      local_e28 = &boost::unit_test::basic_cstring<char_const>::null;
      local_e20 = &boost::unit_test::basic_cstring<char_const>::null;
      file_37.m_end = (iterator)0x20c;
      file_37.m_begin = (iterator)&local_e18;
      msg_37.m_end = pvVar22;
      msg_37.m_begin = pvVar20;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_e28,
                 msg_37);
      paVar32 = (assertion_result *)&bump_fees;
      bump_fees._M_t._M_impl._0_1_ =
           (char)miniminer_info.
                 super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_payload._M_value = (long)anon_var_dwarf_90e34e;
      tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._8_8_ = (long)"tx6_tx7_bumpfee.has_value()" + 0x1b;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
           mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
      mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_011481f0;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      local_e38 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_e30 = "";
      pvVar20 = &DAT_00000001;
      pvVar22 = (iterator)0x0;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&tx3_bump_fee;
      boost::test_tools::tt_detail::report_assertion
                (paVar32,(lazy_ostream *)&mini_miner_tx6_tx7,1,0,WARN,(check_type)pMVar31,
                 (size_t)&local_e38,0x20c);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      local_e48 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_e40 = "";
      local_e58 = &boost::unit_test::basic_cstring<char_const>::null;
      local_e50 = &boost::unit_test::basic_cstring<char_const>::null;
      file_38.m_end = (iterator)0x20d;
      file_38.m_begin = (iterator)&local_e48;
      msg_38.m_end = pvVar22;
      msg_38.m_begin = pvVar20;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_e58,
                 msg_38);
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
           mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
      mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_011480b0;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0xc7f1cc;
      local_e68 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_e60 = "";
      if ((char)miniminer_info.
                super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish == '\0') {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
          std::__throw_bad_optional_access();
        }
      }
      else {
        CVar18 = CFeeRate::GetFee((CFeeRate *)&tx6_tx7_bumpfee,
                                  (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>.
                                       _M_impl.super__Vector_impl_data._M_start[6] +
                                  (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>.
                                       _M_impl.super__Vector_impl_data._M_start[5]);
        bump_fees._M_t._M_impl._0_8_ = CVar18 + -0x157c;
        pvVar20 = (iterator)0x2;
        pvVar25 = &miniminer_info;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                  (&mini_miner_tx6_tx7,&local_e68,0x20d,1,2,pvVar25,"tx6_tx7_bumpfee.value()",
                   paVar32,
                   "just_below_tx4.GetFee(tx_vsizes[5] + tx_vsizes[6]) - (low_fee + med_fee)");
        ::node::MiniMiner::~MiniMiner(&miniminer_pool);
        std::
        _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
        ::~_Rb_tree((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                     *)&descendant_caches);
        ::node::MiniMiner::~MiniMiner(&miniminer_manual);
        miniminer_manual.m_ready_to_calculate = true;
        miniminer_manual._1_7_ = 0x13;
        CFeeRate::CFeeRate((CFeeRate *)&miniminer_info,(CAmount *)&miniminer_manual,
                           *(uint32_t *)
                            (tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_start + 6));
        local_e78 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_e70 = "";
        local_e88 = &boost::unit_test::basic_cstring<char_const>::null;
        local_e80 = &boost::unit_test::basic_cstring<char_const>::null;
        file_39.m_end = (iterator)0x212;
        file_39.m_begin = (iterator)&local_e78;
        msg_39.m_end = (iterator)pvVar25;
        msg_39.m_begin = pvVar20;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_e88
                   ,msg_39);
        bump_fees._M_t._M_impl._0_8_ = 0x18894;
        CFeeRate::CFeeRate((CFeeRate *)&descendant_caches,(CAmount *)&bump_fees,
                           (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start[7] +
                           (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start[5]);
        miniminer_pool.m_ready_to_calculate =
             CONCAT71(miniminer_info.
                      super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                      (byte)miniminer_info.
                            super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start) <=
             (long)descendant_caches._M_t._M_impl._0_8_;
        miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
        mini_miner_tx6_tx7._0_8_ = anon_var_dwarf_90e3ae;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ = "";
        miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ =
             miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
        miniminer_manual._0_8_ = &PTR__lazy_ostream_011481f0;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        local_e98 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_e90 = "";
        pvVar20 = &DAT_00000001;
        pvVar22 = (iterator)0x0;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&mini_miner_tx6_tx7;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&miniminer_pool,(lazy_ostream *)&miniminer_manual,1,0,WARN,
                   (check_type)paVar32,(size_t)&local_e98,0x212);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
        ::node::MiniMiner::MiniMiner(&miniminer_manual,this_00,&all_unspent_outpoints);
        local_ea8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_ea0 = "";
        local_eb8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_eb0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_40.m_end = (iterator)0x214;
        file_40.m_begin = (iterator)&local_ea8;
        msg_40.m_end = pvVar22;
        msg_40.m_begin = pvVar20;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_eb8
                   ,msg_40);
        mini_miner_tx6_tx7.m_ready_to_calculate = miniminer_manual.m_ready_to_calculate;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
        descendant_caches._M_t._M_impl._0_8_ = (long)"!mini_miner.IsReadyToCalculate()" + 1;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = "";
        miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
             miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
        miniminer_pool._0_8_ = &PTR__lazy_ostream_011481f0;
        miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        local_ec8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_ec0 = "";
        pvVar20 = &DAT_00000001;
        pvVar22 = (iterator)0x0;
        miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&descendant_caches;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&mini_miner_tx6_tx7,(lazy_ostream *)&miniminer_pool,1,0,WARN,
                   (check_type)paVar32,(size_t)&local_ec8,0x214);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
        ::node::MiniMiner::CalculateBumpFees
                  ((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                    *)&miniminer_pool,&miniminer_manual,(CFeeRate *)&miniminer_info);
        local_ed8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_ed0 = "";
        local_ee8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_ee0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_41.m_end = (iterator)0x216;
        file_41.m_begin = (iterator)&local_ed8;
        msg_41.m_end = pvVar22;
        msg_41.m_begin = pvVar20;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_ee8
                   ,msg_41);
        descendant_caches._M_t._M_impl._0_8_ =
             CONCAT71(descendant_caches._M_t._M_impl._1_7_,miniminer_manual.m_ready_to_calculate) ^
             1;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        bump_fees._M_t._M_impl._0_8_ = anon_var_dwarf_90df22;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             (long)"!mini_miner.IsReadyToCalculate()" + 0x20;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
             mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
        mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_011481f0;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        local_ef8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_ef0 = "";
        pvVar20 = &DAT_00000001;
        pvVar22 = (iterator)0x0;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&bump_fees;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&descendant_caches,(lazy_ostream *)&mini_miner_tx6_tx7,1,0,
                   WARN,(check_type)paVar32,(size_t)&local_ef8,0x216);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
        local_f08 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_f00 = "";
        local_f18 = &boost::unit_test::basic_cstring<char_const>::null;
        local_f10 = &boost::unit_test::basic_cstring<char_const>::null;
        file_42.m_end = (iterator)0x217;
        file_42.m_begin = (iterator)&local_f08;
        msg_42.m_end = pvVar22;
        msg_42.m_begin = pvVar20;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_f18
                   ,msg_42);
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
             mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
        mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_011480b0;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0xc7f1cc;
        local_f28 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_f20 = "";
        pmVar26 = &descendant_caches;
        descendant_caches._M_t._M_impl._0_8_ =
             miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
        bump_fees._M_t._M_impl._0_8_ =
             ((long)all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x24;
        pvVar20 = (iterator)0x2;
        p_Var30 = (_Base_ptr)&bump_fees;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                  (&mini_miner_tx6_tx7,&local_f28,0x217,1,2,pmVar26,"bump_fees.size()",
                   (_Base_ptr)&bump_fees,"all_unspent_outpoints.size()");
        local_f38 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_f30 = "";
        local_f48 = &boost::unit_test::basic_cstring<char_const>::null;
        local_f40 = &boost::unit_test::basic_cstring<char_const>::null;
        file_43.m_end = (iterator)0x218;
        file_43.m_begin = (iterator)&local_f38;
        msg_43.m_end = (iterator)pmVar26;
        msg_43.m_begin = pvVar20;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_f48
                   ,msg_43);
        bVar13 = sanity_check(&all_transactions,
                              (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                               *)&miniminer_pool);
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        bump_fees._M_t._M_impl._0_8_ = anon_var_dwarf_90df38;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             (long)"sanity_check(all_transactions, bump_fees)" + 0x29;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
             mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
        mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_011481f0;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        local_f58 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_f50 = "";
        pvVar20 = &DAT_00000001;
        pvVar22 = (iterator)0x0;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&bump_fees;
        descendant_caches._M_t._M_impl._0_1_ = bVar13;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&descendant_caches,(lazy_ostream *)&mini_miner_tx6_tx7,1,0,
                   WARN,(check_type)p_Var30,(size_t)&local_f58,0x218);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
        puVar10 = &((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->hash).m_wrapped;
        mini_miner_tx6_tx7.m_ready_to_calculate =
             (bool)(puVar10->super_base_blob<256U>).m_data._M_elems[0];
        mini_miner_tx6_tx7._1_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[1];
        mini_miner_tx6_tx7._2_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[2];
        mini_miner_tx6_tx7._3_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[3];
        mini_miner_tx6_tx7._4_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[4];
        mini_miner_tx6_tx7._5_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[5];
        mini_miner_tx6_tx7._6_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[6];
        mini_miner_tx6_tx7._7_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[7];
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ =
             *(undefined1 (*) [16])
              (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             *(_Base_ptr *)
              (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left.
        _0_4_ = 0;
        iVar17 = std::
                 _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                 ::find((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                         *)&miniminer_pool,(key_type *)&mini_miner_tx6_tx7);
        local_f68 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_f60 = "";
        local_f78 = &boost::unit_test::basic_cstring<char_const>::null;
        local_f70 = &boost::unit_test::basic_cstring<char_const>::null;
        file_44.m_end = (iterator)0x21a;
        file_44.m_begin = (iterator)&local_f68;
        msg_44.m_end = pvVar22;
        msg_44.m_begin = pvVar20;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_f78
                   ,msg_44);
        paVar32 = (assertion_result *)&descendant_caches;
        descendant_caches._M_t._M_impl._0_1_ =
             iVar17._M_node != (_Base_ptr)&miniminer_pool.m_to_be_replaced;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        bump_fees._M_t._M_impl._0_8_ = anon_var_dwarf_90e282;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             (long)"tx6_bumpfee != bump_fees.end()" + 0x1e;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
             mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
        mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_011481f0;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        local_f88 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_f80 = "";
        pvVar20 = &DAT_00000001;
        pvVar22 = (iterator)0x0;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&bump_fees;
        boost::test_tools::tt_detail::report_assertion
                  (paVar32,(lazy_ostream *)&mini_miner_tx6_tx7,1,0,WARN,(check_type)p_Var30,
                   (size_t)&local_f88,0x21a);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
        local_f98 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_f90 = "";
        local_fa8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_fa0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_45.m_end = (iterator)0x21b;
        file_45.m_begin = (iterator)&local_f98;
        msg_45.m_end = pvVar22;
        msg_45.m_begin = pvVar20;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_fa8
                   ,msg_45);
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
             mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
        mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_011480b0;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0xc7f1cc;
        local_fb8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_fb0 = "";
        CVar18 = CFeeRate::GetFee((CFeeRate *)&miniminer_info,
                                  *(uint32_t *)
                                   (tx_vsizes.super__Vector_base<long,_std::allocator<long>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 6));
        pp_Var24 = &iVar17._M_node[2]._M_parent;
        descendant_caches._M_t._M_impl._0_8_ = CVar18 + -5000;
        pvVar20 = (iterator)0x2;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                  (&mini_miner_tx6_tx7,&local_fb8,0x21b,1,2,pp_Var24,"tx6_bumpfee->second",paVar32,
                   "just_above_tx6.GetFee(tx_vsizes[6]) - (med_fee)");
        puVar10 = &((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->hash).m_wrapped;
        mini_miner_tx6_tx7.m_ready_to_calculate =
             (bool)(puVar10->super_base_blob<256U>).m_data._M_elems[0];
        mini_miner_tx6_tx7._1_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[1];
        mini_miner_tx6_tx7._2_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[2];
        mini_miner_tx6_tx7._3_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[3];
        mini_miner_tx6_tx7._4_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[4];
        mini_miner_tx6_tx7._5_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[5];
        mini_miner_tx6_tx7._6_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[6];
        mini_miner_tx6_tx7._7_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[7];
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ =
             *(undefined1 (*) [16])
              (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             *(_Base_ptr *)
              (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left.
        _0_4_ = 0;
        iVar17 = std::
                 _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                 ::find((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                         *)&miniminer_pool,(key_type *)&mini_miner_tx6_tx7);
        local_fc8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_fc0 = "";
        local_fd8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_fd0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_46.m_end = (iterator)0x21d;
        file_46.m_begin = (iterator)&local_fc8;
        msg_46.m_end = (iterator)pp_Var24;
        msg_46.m_begin = pvVar20;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_fd8
                   ,msg_46);
        paVar33 = (assertion_result *)&descendant_caches;
        descendant_caches._M_t._M_impl._0_1_ =
             iVar17._M_node != (_Base_ptr)&miniminer_pool.m_to_be_replaced;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        bump_fees._M_t._M_impl._0_8_ = anon_var_dwarf_90e2b2;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = "";
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
             mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
        mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_011481f0;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        local_fe8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_fe0 = "";
        pvVar20 = &DAT_00000001;
        pvVar22 = (iterator)0x0;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&bump_fees;
        boost::test_tools::tt_detail::report_assertion
                  (paVar33,(lazy_ostream *)&mini_miner_tx6_tx7,1,0,WARN,(check_type)paVar32,
                   (size_t)&local_fe8,0x21d);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
        local_ff8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_ff0 = "";
        local_1008 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1000 = &boost::unit_test::basic_cstring<char_const>::null;
        file_47.m_end = (iterator)0x21e;
        file_47.m_begin = (iterator)&local_ff8;
        msg_47.m_end = pvVar22;
        msg_47.m_begin = pvVar20;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,
                   (size_t)&local_1008,msg_47);
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
             mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
        mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_011480b0;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0xc7f1cc;
        local_1018 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_1010 = "";
        descendant_caches._M_t._M_impl._0_8_ =
             descendant_caches._M_t._M_impl._0_8_ & 0xffffffff00000000;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                  (&mini_miner_tx6_tx7,&local_1018,0x21e,1,2,&iVar17._M_node[2]._M_parent,
                   "tx7_bumpfee->second",paVar33,"0");
        std::
        _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
        ::~_Rb_tree((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                     *)&miniminer_pool);
        ::node::MiniMiner::~MiniMiner(&miniminer_manual);
        miniminer_info.
        super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
        ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
        miniminer_info.
        super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
        ._M_impl.super__Vector_impl_data._M_start._1_7_ = 0;
        miniminer_info.
        super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_1_ = '\0';
        miniminer_info.
        super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
        miniminer_info.
        super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
        emplace_back<std::shared_ptr<CTransaction_const>const&,long&,long&,long_const&,long_const&>
                  ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>
                    *)&miniminer_info,&tx0,
                   tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start,&low_fee,&low_fee);
        std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
        emplace_back<std::shared_ptr<CTransaction_const>const&,long&,long&,long_const&,long_const&>
                  ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>
                    *)&miniminer_info,&tx1,
                   tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start + 1,
                   tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start + 1,&med_fee,&med_fee);
        std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
        emplace_back<std::shared_ptr<CTransaction_const>const&,long&,long&,long_const&,long_const&>
                  ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>
                    *)&miniminer_info,&tx2,
                   tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start + 2,
                   tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start + 2,&high_fee,&high_fee);
        miniminer_manual._0_8_ =
             tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start[3] +
             tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start[1] +
             tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start[2] +
             *tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
        miniminer_pool.m_ready_to_calculate = true;
        miniminer_pool._1_7_ = 0x322;
        std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
        emplace_back<std::shared_ptr<CTransaction_const>const&,long&,long,long_const&,long>
                  ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>
                    *)&miniminer_info,&tx3,
                   tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start + 3,(long *)&miniminer_manual,&high_fee,
                   (long *)&miniminer_pool);
        std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
        emplace_back<std::shared_ptr<CTransaction_const>const&,long&,long&,long_const&,long_const&>
                  ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>
                    *)&miniminer_info,&tx4,
                   tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start + 4,
                   tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start + 4,&high_fee,&high_fee);
        miniminer_manual._0_8_ =
             tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start[5] +
             tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start[4];
        miniminer_pool.m_ready_to_calculate = true;
        miniminer_pool._1_7_ = 0x188;
        std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
        emplace_back<std::shared_ptr<CTransaction_const>const&,long&,long,long_const&,long>
                  ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>
                    *)&miniminer_info,&tx5,
                   tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start + 5,(long *)&miniminer_manual,&low_fee,
                   (long *)&miniminer_pool);
        miniminer_manual._0_8_ =
             tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start[5] +
             tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start[4] +
             tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start[6];
        miniminer_pool.m_ready_to_calculate = true;
        miniminer_pool._1_7_ = 0x19c;
        std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
        emplace_back<std::shared_ptr<CTransaction_const>const&,long&,long,long_const&,long>
                  ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>
                    *)&miniminer_info,&tx6,
                   tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start + 6,(long *)&miniminer_manual,&med_fee,
                   (long *)&miniminer_pool);
        miniminer_manual._0_8_ =
             tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start[5] +
             tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start[4] +
             tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start[7];
        pMVar23 = &miniminer_pool;
        miniminer_pool.m_ready_to_calculate = true;
        miniminer_pool._1_7_ = 0x30f;
        std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
        emplace_back<std::shared_ptr<CTransaction_const>const&,long&,long,long_const&,long>
                  ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>
                    *)&miniminer_info,&tx7,
                   tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start + 7,(long *)&miniminer_manual,&high_fee,
                   (long *)pMVar23);
        peVar3 = tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._4_8_ << 0x20;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
        puVar10 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->hash).m_wrapped;
        miniminer_manual.m_ready_to_calculate =
             (bool)(puVar10->super_base_blob<256U>).m_data._M_elems[0];
        miniminer_manual._1_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[1];
        miniminer_manual._2_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[2];
        miniminer_manual._3_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[3];
        miniminer_manual._4_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[4];
        miniminer_manual._5_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[5];
        miniminer_manual._6_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[6];
        miniminer_manual._7_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[7];
        pbVar11 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->hash).m_wrapped.super_base_blob<256U>;
        miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar11->m_data)._M_elems[8];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar11->m_data)._M_elems[9];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar11->m_data)._M_elems[10];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar11->m_data)._M_elems[0xb];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar11->m_data)._M_elems[0xc];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar11->m_data)._M_elems[0xd];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar11->m_data)._M_elems[0xe];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar11->m_data)._M_elems[0xf];
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             *(undefined8 *)
              (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             *(_Base_ptr *)
              (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        uVar6 = *(undefined8 *)
                 ((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        uVar7 = *(undefined8 *)
                 (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        uVar8 = *(undefined8 *)
                 (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        uVar9 = *(undefined8 *)
                 (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_
             = SUB84(uVar6,0);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_
             = (undefined4)((ulong)uVar6 >> 0x20);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right.
        _0_4_ = (undefined4)uVar7;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right.
        _4_4_ = (undefined4)((ulong)uVar7 >> 0x20);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
             (undefined4)uVar8;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             (undefined4)((ulong)uVar8 >> 0x20);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84(uVar9,0);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ =
             SUB84((ulong)uVar9 >> 0x20,0);
        __l_12._M_len = 2;
        __l_12._M_array = (iterator)&miniminer_manual;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        std::
        set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
               *)&miniminer_pool,__l_12,(less<transaction_identifier<false>_> *)&mini_miner_tx6_tx7,
              (allocator_type *)&bump_fees);
        std::
        _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
        ::
        _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                  ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                    *)&descendant_caches,&peVar3->hash,
                   (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                    *)&miniminer_pool);
        std::
        _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                     *)&miniminer_pool);
        peVar3 = tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        puVar10 = &((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->hash).m_wrapped;
        miniminer_manual.m_ready_to_calculate =
             (bool)(puVar10->super_base_blob<256U>).m_data._M_elems[0];
        miniminer_manual._1_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[1];
        miniminer_manual._2_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[2];
        miniminer_manual._3_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[3];
        miniminer_manual._4_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[4];
        miniminer_manual._5_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[5];
        miniminer_manual._6_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[6];
        miniminer_manual._7_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[7];
        pbVar11 = &((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->hash).m_wrapped.super_base_blob<256U>;
        miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar11->m_data)._M_elems[8];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar11->m_data)._M_elems[9];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar11->m_data)._M_elems[10];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar11->m_data)._M_elems[0xb];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar11->m_data)._M_elems[0xc];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar11->m_data)._M_elems[0xd];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar11->m_data)._M_elems[0xe];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar11->m_data)._M_elems[0xf];
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             *(undefined8 *)
              (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             *(_Base_ptr *)
              (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        uVar6 = *(undefined8 *)
                 ((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        uVar7 = *(undefined8 *)
                 (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        uVar8 = *(undefined8 *)
                 (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        uVar9 = *(undefined8 *)
                 (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_
             = SUB84(uVar6,0);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_
             = (undefined4)((ulong)uVar6 >> 0x20);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right.
        _0_4_ = (undefined4)uVar7;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right.
        _4_4_ = (undefined4)((ulong)uVar7 >> 0x20);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
             (undefined4)uVar8;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             (undefined4)((ulong)uVar8 >> 0x20);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84(uVar9,0);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ =
             SUB84((ulong)uVar9 >> 0x20,0);
        __l_13._M_len = 2;
        __l_13._M_array = (iterator)&miniminer_manual;
        std::
        set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
               *)&miniminer_pool,__l_13,(less<transaction_identifier<false>_> *)&mini_miner_tx6_tx7,
              (allocator_type *)&bump_fees);
        std::
        _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
        ::
        _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                  ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                    *)&descendant_caches,&peVar3->hash,
                   (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                    *)&miniminer_pool);
        std::
        _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                     *)&miniminer_pool);
        peVar3 = tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        puVar10 = &((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->hash).m_wrapped;
        miniminer_manual.m_ready_to_calculate =
             (bool)(puVar10->super_base_blob<256U>).m_data._M_elems[0];
        miniminer_manual._1_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[1];
        miniminer_manual._2_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[2];
        miniminer_manual._3_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[3];
        miniminer_manual._4_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[4];
        miniminer_manual._5_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[5];
        miniminer_manual._6_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[6];
        miniminer_manual._7_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[7];
        pbVar11 = &((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->hash).m_wrapped.super_base_blob<256U>;
        miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar11->m_data)._M_elems[8];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar11->m_data)._M_elems[9];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar11->m_data)._M_elems[10];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar11->m_data)._M_elems[0xb];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar11->m_data)._M_elems[0xc];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar11->m_data)._M_elems[0xd];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar11->m_data)._M_elems[0xe];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar11->m_data)._M_elems[0xf];
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             *(undefined8 *)
              (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             *(_Base_ptr *)
              (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        uVar6 = *(undefined8 *)
                 ((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        uVar7 = *(undefined8 *)
                 (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        uVar8 = *(undefined8 *)
                 (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        uVar9 = *(undefined8 *)
                 (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_
             = SUB84(uVar6,0);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_
             = (undefined4)((ulong)uVar6 >> 0x20);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right.
        _0_4_ = (undefined4)uVar7;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right.
        _4_4_ = (undefined4)((ulong)uVar7 >> 0x20);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
             (undefined4)uVar8;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             (undefined4)((ulong)uVar8 >> 0x20);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84(uVar9,0);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ =
             SUB84((ulong)uVar9 >> 0x20,0);
        __l_14._M_len = 2;
        __l_14._M_array = (iterator)&miniminer_manual;
        std::
        set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
               *)&miniminer_pool,__l_14,(less<transaction_identifier<false>_> *)&mini_miner_tx6_tx7,
              (allocator_type *)&bump_fees);
        std::
        _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
        ::
        _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                  ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                    *)&descendant_caches,&peVar3->hash,
                   (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                    *)&miniminer_pool);
        std::
        _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                     *)&miniminer_pool);
        peVar3 = tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        puVar10 = &((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->hash).m_wrapped;
        miniminer_pool.m_ready_to_calculate =
             (bool)(puVar10->super_base_blob<256U>).m_data._M_elems[0];
        miniminer_pool._1_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[1];
        miniminer_pool._2_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[2];
        miniminer_pool._3_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[3];
        miniminer_pool._4_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[4];
        miniminer_pool._5_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[5];
        miniminer_pool._6_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[6];
        miniminer_pool._7_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[7];
        miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ =
             *(undefined1 (*) [16])
              (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             *(_Base_ptr *)
              (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        __l_15._M_len = 1;
        __l_15._M_array = (iterator)&miniminer_pool;
        std::
        set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
               *)&miniminer_manual,__l_15,
              (less<transaction_identifier<false>_> *)&mini_miner_tx6_tx7,
              (allocator_type *)&bump_fees);
        std::
        _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
        ::
        _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                  ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                    *)&descendant_caches,&peVar3->hash,
                   (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                    *)&miniminer_manual);
        std::
        _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                     *)&miniminer_manual);
        peVar3 = tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        puVar10 = &((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->hash).m_wrapped;
        miniminer_manual.m_ready_to_calculate =
             (bool)(puVar10->super_base_blob<256U>).m_data._M_elems[0];
        miniminer_manual._1_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[1];
        miniminer_manual._2_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[2];
        miniminer_manual._3_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[3];
        miniminer_manual._4_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[4];
        miniminer_manual._5_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[5];
        miniminer_manual._6_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[6];
        miniminer_manual._7_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[7];
        pbVar11 = &((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->hash).m_wrapped.super_base_blob<256U>;
        miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar11->m_data)._M_elems[8];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar11->m_data)._M_elems[9];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar11->m_data)._M_elems[10];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar11->m_data)._M_elems[0xb];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar11->m_data)._M_elems[0xc];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar11->m_data)._M_elems[0xd];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar11->m_data)._M_elems[0xe];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar11->m_data)._M_elems[0xf];
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             *(undefined8 *)
              (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             *(_Base_ptr *)
              (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        uVar6 = *(undefined8 *)
                 ((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        uVar7 = *(undefined8 *)
                 (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        uVar8 = *(undefined8 *)
                 (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        uVar9 = *(undefined8 *)
                 (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
             (undefined4)uVar8;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             (undefined4)((ulong)uVar8 >> 0x20);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84(uVar9,0);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ =
             SUB84((ulong)uVar9 >> 0x20,0);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_
             = SUB84(uVar6,0);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_
             = (undefined4)((ulong)uVar6 >> 0x20);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right.
        _0_4_ = (undefined4)uVar7;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right.
        _4_4_ = (undefined4)((ulong)uVar7 >> 0x20);
        uVar6 = *(undefined8 *)
                 ((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_parent = *(_Base_ptr *)
                     (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_left = *(_Base_ptr *)
                   (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_right = *(_Base_ptr *)
                    (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      )->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_color = (_Rb_tree_color)uVar6;
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
        _4_4_ = SUB84((ulong)uVar6 >> 0x20,0);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header.
        _M_node_count =
             *(size_t *)
              ((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash
              ).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        uVar6 = *(undefined8 *)
                 (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        uVar7 = *(undefined8 *)
                 (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        uVar8 = *(undefined8 *)
                 (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             (_Rb_tree_color)uVar7;
        miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
             SUB84((ulong)uVar7 >> 0x20,0);
        miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_parent.
        _0_4_ = (undefined4)uVar8;
        miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_parent.
        _4_4_ = (undefined4)((ulong)uVar8 >> 0x20);
        miniminer_manual.m_inclusion_order._M_t._M_impl._0_4_ = SUB84(uVar6,0);
        miniminer_manual.m_inclusion_order._M_t._M_impl._4_4_ = SUB84((ulong)uVar6 >> 0x20,0);
        __l_16._M_len = 4;
        __l_16._M_array = (iterator)&miniminer_manual;
        std::
        set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
               *)&miniminer_pool,__l_16,(less<transaction_identifier<false>_> *)&mini_miner_tx6_tx7,
              (allocator_type *)&bump_fees);
        std::
        _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
        ::
        _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                  ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                    *)&descendant_caches,&peVar3->hash,
                   (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                    *)&miniminer_pool);
        std::
        _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                     *)&miniminer_pool);
        peVar3 = tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        puVar10 = &((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->hash).m_wrapped;
        miniminer_manual.m_ready_to_calculate =
             (bool)(puVar10->super_base_blob<256U>).m_data._M_elems[0];
        miniminer_manual._1_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[1];
        miniminer_manual._2_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[2];
        miniminer_manual._3_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[3];
        miniminer_manual._4_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[4];
        miniminer_manual._5_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[5];
        miniminer_manual._6_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[6];
        miniminer_manual._7_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[7];
        pbVar11 = &((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->hash).m_wrapped.super_base_blob<256U>;
        miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar11->m_data)._M_elems[8];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar11->m_data)._M_elems[9];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar11->m_data)._M_elems[10];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar11->m_data)._M_elems[0xb];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar11->m_data)._M_elems[0xc];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar11->m_data)._M_elems[0xd];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar11->m_data)._M_elems[0xe];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar11->m_data)._M_elems[0xf];
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             *(undefined8 *)
              (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             *(_Base_ptr *)
              (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        uVar6 = *(undefined8 *)
                 ((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        uVar7 = *(undefined8 *)
                 (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        uVar8 = *(undefined8 *)
                 (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        uVar9 = *(undefined8 *)
                 (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_
             = SUB84(uVar6,0);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_
             = (undefined4)((ulong)uVar6 >> 0x20);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right.
        _0_4_ = (undefined4)uVar7;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right.
        _4_4_ = (undefined4)((ulong)uVar7 >> 0x20);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
             (undefined4)uVar8;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             (undefined4)((ulong)uVar8 >> 0x20);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84(uVar9,0);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ =
             SUB84((ulong)uVar9 >> 0x20,0);
        uVar6 = *(undefined8 *)
                 ((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_parent = *(_Base_ptr *)
                     (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_left = *(_Base_ptr *)
                   (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_right = *(_Base_ptr *)
                    (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      )->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_color = (_Rb_tree_color)uVar6;
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
        _4_4_ = SUB84((ulong)uVar6 >> 0x20,0);
        __l_17._M_len = 3;
        __l_17._M_array = (iterator)&miniminer_manual;
        std::
        set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
               *)&miniminer_pool,__l_17,(less<transaction_identifier<false>_> *)&mini_miner_tx6_tx7,
              (allocator_type *)&bump_fees);
        std::
        _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
        ::
        _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                  ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                    *)&descendant_caches,&peVar3->hash,
                   (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                    *)&miniminer_pool);
        std::
        _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                     *)&miniminer_pool);
        peVar3 = tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        puVar10 = &((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->hash).m_wrapped;
        miniminer_pool.m_ready_to_calculate =
             (bool)(puVar10->super_base_blob<256U>).m_data._M_elems[0];
        miniminer_pool._1_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[1];
        miniminer_pool._2_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[2];
        miniminer_pool._3_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[3];
        miniminer_pool._4_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[4];
        miniminer_pool._5_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[5];
        miniminer_pool._6_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[6];
        miniminer_pool._7_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[7];
        miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ =
             *(undefined1 (*) [16])
              (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             *(_Base_ptr *)
              (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        __l_18._M_len = 1;
        __l_18._M_array = (iterator)&miniminer_pool;
        std::
        set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
               *)&miniminer_manual,__l_18,
              (less<transaction_identifier<false>_> *)&mini_miner_tx6_tx7,
              (allocator_type *)&bump_fees);
        std::
        _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
        ::
        _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                  ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                    *)&descendant_caches,&peVar3->hash,
                   (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                    *)&miniminer_manual);
        std::
        _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                     *)&miniminer_manual);
        peVar3 = tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        puVar10 = &((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->hash).m_wrapped;
        miniminer_pool.m_ready_to_calculate =
             (bool)(puVar10->super_base_blob<256U>).m_data._M_elems[0];
        miniminer_pool._1_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[1];
        miniminer_pool._2_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[2];
        miniminer_pool._3_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[3];
        miniminer_pool._4_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[4];
        miniminer_pool._5_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[5];
        miniminer_pool._6_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[6];
        miniminer_pool._7_1_ = (puVar10->super_base_blob<256U>).m_data._M_elems[7];
        miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ =
             *(undefined1 (*) [16])
              (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             *(_Base_ptr *)
              (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        __a = (allocator_type *)&bump_fees;
        __l_19._M_len = 1;
        __l_19._M_array = (iterator)&miniminer_pool;
        std::
        set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
               *)&miniminer_manual,__l_19,
              (less<transaction_identifier<false>_> *)&mini_miner_tx6_tx7,__a);
        std::
        _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
        ::
        _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                  ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                    *)&descendant_caches,&peVar3->hash,
                   (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                    *)&miniminer_manual);
        std::
        _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                     *)&miniminer_manual);
        ::node::MiniMiner::MiniMiner(&miniminer_manual,&miniminer_info,&descendant_caches);
        ::node::MiniMiner::MiniMiner(&miniminer_pool,this_00,&all_unspent_outpoints);
        local_1028 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_1020 = "";
        local_1038 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1030 = &boost::unit_test::basic_cstring<char_const>::null;
        file_48.m_end = (iterator)0x238;
        file_48.m_begin = (iterator)&local_1028;
        msg_48.m_end = &pMVar23->m_ready_to_calculate;
        msg_48.m_begin = (iterator)__a;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_48,
                   (size_t)&local_1038,msg_48);
        bump_fees._M_t._M_impl._0_1_ = miniminer_manual.m_ready_to_calculate;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_payload._M_value = (long)anon_var_dwarf_90e0ac;
        tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._8_8_ =
             (long)"miniminer_manual.IsReadyToCalculate()" + 0x25;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
             mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
        mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_011481f0;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        local_1048 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_1040 = "";
        pvVar20 = &DAT_00000001;
        pvVar22 = (iterator)0x0;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&tx3_bump_fee;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&bump_fees,(lazy_ostream *)&mini_miner_tx6_tx7,1,0,WARN,
                   (check_type)paVar33,(size_t)&local_1048,0x238);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                  );
        local_1058 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_1050 = "";
        local_1068 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1060 = &boost::unit_test::basic_cstring<char_const>::null;
        file_49.m_end = (iterator)0x239;
        file_49.m_begin = (iterator)&local_1058;
        msg_49.m_end = pvVar22;
        msg_49.m_begin = pvVar20;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_49,
                   (size_t)&local_1068,msg_49);
        bump_fees._M_t._M_impl._0_1_ = miniminer_pool.m_ready_to_calculate;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_payload._M_value = (long)anon_var_dwarf_90e0c4;
        tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._8_8_ =
             (long)"miniminer_pool.IsReadyToCalculate()" + 0x23;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
             mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
        mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_011481f0;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        local_1078 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_1070 = "";
        pvVar20 = &DAT_00000001;
        poVar27 = (optional<long> *)0x0;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&tx3_bump_fee;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&bump_fees,(lazy_ostream *)&mini_miner_tx6_tx7,1,0,WARN,
                   (check_type)paVar33,(size_t)&local_1078,0x239);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                  );
        ::node::MiniMiner::Linearize
                  ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                    *)&mini_miner_tx6_tx7,&miniminer_manual);
        ::node::MiniMiner::Linearize
                  ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                    *)&mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count,&miniminer_pool);
        for (lVar19 = 0; lVar19 != 0x60; lVar19 = lVar19 + 0x30) {
          local_1088 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_1080 = "";
          local_1098 = &boost::unit_test::basic_cstring<char_const>::null;
          local_1090 = &boost::unit_test::basic_cstring<char_const>::null;
          file_50.m_end = (iterator)0x23c;
          file_50.m_begin = (iterator)&local_1088;
          msg_50.m_end = (iterator)poVar27;
          msg_50.m_begin = pvVar20;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_50,
                     (size_t)&local_1098,msg_50);
          map = &mini_miner_tx6_tx7.m_ready_to_calculate + lVar19;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
          bump_fees._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011480b0;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)boost::unit_test::lazy_ostream::inst;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc7f1cc;
          local_10a8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_10a0 = "";
          uVar14 = Find<transaction_identifier<false>,unsigned_int>
                             ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                               *)map,&(tx4.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->hash);
          tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value._0_4_ = uVar14;
          tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value =
               tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_payload._M_value & 0xffffffff00000000;
          pvVar20 = (iterator)0x2;
          poVar27 = &tx3_bump_fee;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                    (&bump_fees,&local_10a8,0x23c,1,2,&tx3_bump_fee,
                     "Find(sequences, tx4->GetHash())",&tx6_tx7_bumpfee,"0");
          local_10b8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_10b0 = "";
          local_10c8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_10c0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_51.m_end = (iterator)0x23d;
          file_51.m_begin = (iterator)&local_10b8;
          msg_51.m_end = (iterator)poVar27;
          msg_51.m_begin = pvVar20;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_51,
                     (size_t)&local_10c8,msg_51);
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
          bump_fees._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011480b0;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)boost::unit_test::lazy_ostream::inst;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc7f1cc;
          local_10d8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_10d0 = "";
          uVar14 = Find<transaction_identifier<false>,unsigned_int>
                             ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                               *)map,&(tx2.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->hash);
          tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value._0_4_ = uVar14;
          tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value._0_4_ = 1;
          pvVar20 = (iterator)0x2;
          poVar27 = &tx3_bump_fee;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                    (&bump_fees,&local_10d8,0x23d,1,2,&tx3_bump_fee,
                     "Find(sequences, tx2->GetHash())",&tx6_tx7_bumpfee,"1");
          local_10e8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_10e0 = "";
          local_10f8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_10f0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_52.m_end = (iterator)0x240;
          file_52.m_begin = (iterator)&local_10e8;
          msg_52.m_end = (iterator)poVar27;
          msg_52.m_begin = pvVar20;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_52,
                     (size_t)&local_10f8,msg_52);
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
          bump_fees._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011480b0;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)boost::unit_test::lazy_ostream::inst;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc7f1cc;
          local_1108 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_1100 = "";
          uVar14 = Find<transaction_identifier<false>,unsigned_int>
                             ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                               *)map,&(tx5.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->hash);
          tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value._0_4_ = uVar14;
          tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value._0_4_ = 2;
          pvVar20 = (iterator)0x2;
          poVar27 = &tx3_bump_fee;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                    (&bump_fees,&local_1108,0x240,1,2,&tx3_bump_fee,
                     "Find(sequences, tx5->GetHash())",&tx6_tx7_bumpfee,"2");
          local_1118 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_1110 = "";
          local_1128 = &boost::unit_test::basic_cstring<char_const>::null;
          local_1120 = &boost::unit_test::basic_cstring<char_const>::null;
          file_53.m_end = (iterator)0x241;
          file_53.m_begin = (iterator)&local_1118;
          msg_53.m_end = (iterator)poVar27;
          msg_53.m_begin = pvVar20;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_53,
                     (size_t)&local_1128,msg_53);
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
          bump_fees._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011480b0;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)boost::unit_test::lazy_ostream::inst;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc7f1cc;
          local_1138 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_1130 = "";
          uVar14 = Find<transaction_identifier<false>,unsigned_int>
                             ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                               *)map,&(tx7.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->hash);
          tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value._0_4_ = uVar14;
          tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value._0_4_ = 2;
          pvVar20 = (iterator)0x2;
          poVar27 = &tx3_bump_fee;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                    (&bump_fees,&local_1138,0x241,1,2,&tx3_bump_fee,
                     "Find(sequences, tx7->GetHash())",&tx6_tx7_bumpfee,"2");
          local_1148 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_1140 = "";
          local_1158 = &boost::unit_test::basic_cstring<char_const>::null;
          local_1150 = &boost::unit_test::basic_cstring<char_const>::null;
          file_54.m_end = (iterator)0x244;
          file_54.m_begin = (iterator)&local_1148;
          msg_54.m_end = (iterator)poVar27;
          msg_54.m_begin = pvVar20;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_54,
                     (size_t)&local_1158,msg_54);
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
          bump_fees._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011480b0;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)boost::unit_test::lazy_ostream::inst;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc7f1cc;
          local_1168 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_1160 = "";
          uVar14 = Find<transaction_identifier<false>,unsigned_int>
                             ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                               *)map,&(tx0.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->hash);
          tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value._0_4_ = uVar14;
          tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value._0_4_ = 3;
          pvVar20 = (iterator)0x2;
          poVar27 = &tx3_bump_fee;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                    (&bump_fees,&local_1168,0x244,1,2,&tx3_bump_fee,
                     "Find(sequences, tx0->GetHash())",&tx6_tx7_bumpfee,"3");
          local_1178 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_1170 = "";
          local_1188 = &boost::unit_test::basic_cstring<char_const>::null;
          local_1180 = &boost::unit_test::basic_cstring<char_const>::null;
          file_55.m_end = (iterator)0x245;
          file_55.m_begin = (iterator)&local_1178;
          msg_55.m_end = (iterator)poVar27;
          msg_55.m_begin = pvVar20;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_55,
                     (size_t)&local_1188,msg_55);
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
          bump_fees._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011480b0;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)boost::unit_test::lazy_ostream::inst;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc7f1cc;
          local_1198 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_1190 = "";
          uVar14 = Find<transaction_identifier<false>,unsigned_int>
                             ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                               *)map,&(tx1.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->hash);
          tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value._0_4_ = uVar14;
          tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value._0_4_ = 3;
          pvVar20 = (iterator)0x2;
          poVar27 = &tx3_bump_fee;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                    (&bump_fees,&local_1198,0x245,1,2,&tx3_bump_fee,
                     "Find(sequences, tx1->GetHash())",&tx6_tx7_bumpfee,"3");
          local_11a8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_11a0 = "";
          local_11b8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_11b0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_56.m_end = (iterator)0x246;
          file_56.m_begin = (iterator)&local_11a8;
          msg_56.m_end = (iterator)poVar27;
          msg_56.m_begin = pvVar20;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_56,
                     (size_t)&local_11b8,msg_56);
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
          bump_fees._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011480b0;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)boost::unit_test::lazy_ostream::inst;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc7f1cc;
          local_11c8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_11c0 = "";
          uVar14 = Find<transaction_identifier<false>,unsigned_int>
                             ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                               *)map,&(tx3.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->hash);
          tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value._0_4_ = uVar14;
          tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value._0_4_ = 3;
          pvVar20 = (iterator)0x2;
          poVar27 = &tx3_bump_fee;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                    (&bump_fees,&local_11c8,0x246,1,2,&tx3_bump_fee,
                     "Find(sequences, tx3->GetHash())",&tx6_tx7_bumpfee,"3");
          local_11d8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_11d0 = "";
          local_11e8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_11e0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_57.m_end = (iterator)0x249;
          file_57.m_begin = (iterator)&local_11d8;
          msg_57.m_end = (iterator)poVar27;
          msg_57.m_begin = pvVar20;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_57,
                     (size_t)&local_11e8,msg_57);
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
          bump_fees._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011480b0;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)boost::unit_test::lazy_ostream::inst;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc7f1cc;
          local_11f8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_11f0 = "";
          uVar14 = Find<transaction_identifier<false>,unsigned_int>
                             ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                               *)map,&(tx6.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->hash);
          tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value._0_4_ = uVar14;
          tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value._0_4_ = 4;
          pvVar20 = (iterator)0x2;
          poVar27 = &tx3_bump_fee;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                    (&bump_fees,&local_11f8,0x249,1,2,&tx3_bump_fee,
                     "Find(sequences, tx6->GetHash())",&tx6_tx7_bumpfee,"4");
        }
        lVar19 = 0x30;
        do {
          std::
          _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
          ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                       *)(&mini_miner_tx6_tx7.m_ready_to_calculate + lVar19));
          lVar19 = lVar19 + -0x30;
        } while (lVar19 != -0x30);
        ::node::MiniMiner::~MiniMiner(&miniminer_pool);
        ::node::MiniMiner::~MiniMiner(&miniminer_manual);
        std::
        _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
        ::~_Rb_tree(&descendant_caches._M_t);
        std::vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>::
        ~vector(&miniminer_info);
        std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
                  (&all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)
        ;
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                  (&tx_vsizes.super__Vector_base<long,_std::allocator<long>_>);
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::~vector(&all_transactions);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
          return;
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(miniminer_overlap, TestChain100Setup)
{
/*      Tx graph for `miniminer_overlap` unit test:
 *
 *     coinbase_tx [mined]        ... block-chain
 *  -------------------------------------------------
 *      /   |   \          \      ... mempool
 *     /    |    \         |
 *   tx0   tx1   tx2      tx4
 *  [low] [med] [high]   [high]
 *     \    |    /         |
 *      \   |   /         tx5
 *       \  |  /         [low]
 *         tx3          /     \
 *        [high]       tx6    tx7
 *                    [med]  [high]
 *
 *  NOTE:
 *  -> "low"/"med"/"high" denote the _absolute_ fee of each tx
 *  -> tx3 has 3 inputs and 3 outputs, all other txs have 1 input and 2 outputs
 *  -> tx3's feerate is lower than tx2's, as tx3 has more weight (due to having more inputs and outputs)
 *
 *  -> tx2_FR = high / tx2_vsize
 *  -> tx3_FR = high / tx3_vsize
 *  -> tx3_ASFR = (low+med+high+high) / (tx0_vsize + tx1_vsize + tx2_vsize + tx3_vsize)
 *  -> tx4_FR = high / tx4_vsize
 *  -> tx6_ASFR = (high+low+med) / (tx4_vsize + tx5_vsize + tx6_vsize)
 *  -> tx7_ASFR = (high+low+high) / (tx4_vsize + tx5_vsize + tx7_vsize) */

    CTxMemPool& pool = *Assert(m_node.mempool);
    LOCK2(::cs_main, pool.cs);
    TestMemPoolEntryHelper entry;

    // Create 3 parents of different feerates, and 1 child spending outputs from all 3 parents.
    const auto tx0 = make_tx({COutPoint{m_coinbase_txns[0]->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(low_fee).FromTx(tx0));
    const auto tx1 = make_tx({COutPoint{m_coinbase_txns[1]->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(med_fee).FromTx(tx1));
    const auto tx2 = make_tx({COutPoint{m_coinbase_txns[2]->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(high_fee).FromTx(tx2));
    const auto tx3 = make_tx({COutPoint{tx0->GetHash(), 0}, COutPoint{tx1->GetHash(), 0}, COutPoint{tx2->GetHash(), 0}}, /*num_outputs=*/3);
    pool.addUnchecked(entry.Fee(high_fee).FromTx(tx3));

    // Create 1 grandparent and 1 parent, then 2 children.
    const auto tx4 = make_tx({COutPoint{m_coinbase_txns[3]->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(high_fee).FromTx(tx4));
    const auto tx5 = make_tx({COutPoint{tx4->GetHash(), 0}}, /*num_outputs=*/3);
    pool.addUnchecked(entry.Fee(low_fee).FromTx(tx5));
    const auto tx6 = make_tx({COutPoint{tx5->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(med_fee).FromTx(tx6));
    const auto tx7 = make_tx({COutPoint{tx5->GetHash(), 1}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(high_fee).FromTx(tx7));

    std::vector<CTransactionRef> all_transactions{tx0, tx1, tx2, tx3, tx4, tx5, tx6, tx7};
    std::vector<int64_t> tx_vsizes;
    tx_vsizes.reserve(all_transactions.size());
    for (const auto& tx : all_transactions) tx_vsizes.push_back(GetVirtualTransactionSize(*tx));

    std::vector<COutPoint> all_unspent_outpoints({
        COutPoint{tx0->GetHash(), 1},
        COutPoint{tx1->GetHash(), 1},
        COutPoint{tx2->GetHash(), 1},
        COutPoint{tx3->GetHash(), 0},
        COutPoint{tx3->GetHash(), 1},
        COutPoint{tx3->GetHash(), 2},
        COutPoint{tx4->GetHash(), 1},
        COutPoint{tx5->GetHash(), 2},
        COutPoint{tx6->GetHash(), 0},
        COutPoint{tx7->GetHash(), 0}
    });
    for (const auto& outpoint : all_unspent_outpoints) BOOST_CHECK(!pool.isSpent(outpoint));

    const auto tx2_feerate = CFeeRate(high_fee, tx_vsizes[2]);
    const auto tx3_feerate = CFeeRate(high_fee, tx_vsizes[3]);
    // tx3's feerate is lower than tx2's. same fee, different weight.
    BOOST_CHECK(tx2_feerate > tx3_feerate);
    const auto tx3_anc_feerate = CFeeRate(low_fee + med_fee + high_fee + high_fee, tx_vsizes[0] + tx_vsizes[1] + tx_vsizes[2] + tx_vsizes[3]);
    const auto& tx3_entry{*Assert(pool.GetEntry(tx3->GetHash()))};
    BOOST_CHECK(tx3_anc_feerate == CFeeRate(tx3_entry.GetModFeesWithAncestors(), tx3_entry.GetSizeWithAncestors()));
    const auto tx4_feerate = CFeeRate(high_fee, tx_vsizes[4]);
    const auto tx6_anc_feerate = CFeeRate(high_fee + low_fee + med_fee, tx_vsizes[4] + tx_vsizes[5] + tx_vsizes[6]);
    const auto& tx6_entry{*Assert(pool.GetEntry(tx6->GetHash()))};
    BOOST_CHECK(tx6_anc_feerate == CFeeRate(tx6_entry.GetModFeesWithAncestors(), tx6_entry.GetSizeWithAncestors()));
    const auto tx7_anc_feerate = CFeeRate(high_fee + low_fee + high_fee, tx_vsizes[4] + tx_vsizes[5] + tx_vsizes[7]);
    const auto& tx7_entry{*Assert(pool.GetEntry(tx7->GetHash()))};
    BOOST_CHECK(tx7_anc_feerate == CFeeRate(tx7_entry.GetModFeesWithAncestors(), tx7_entry.GetSizeWithAncestors()));
    BOOST_CHECK(tx4_feerate > tx6_anc_feerate);
    BOOST_CHECK(tx4_feerate > tx7_anc_feerate);

    // Extremely high feerate: everybody's bumpfee is from their full ancestor set.
    {
        node::MiniMiner mini_miner(pool, all_unspent_outpoints);
        const CFeeRate very_high_feerate(COIN);
        BOOST_CHECK(tx3_anc_feerate < very_high_feerate);
        BOOST_CHECK(mini_miner.IsReadyToCalculate());
        auto bump_fees = mini_miner.CalculateBumpFees(very_high_feerate);
        BOOST_CHECK_EQUAL(bump_fees.size(), all_unspent_outpoints.size());
        BOOST_CHECK(!mini_miner.IsReadyToCalculate());
        BOOST_CHECK(sanity_check(all_transactions, bump_fees));
        const auto tx0_bumpfee = bump_fees.find(COutPoint{tx0->GetHash(), 1});
        BOOST_CHECK(tx0_bumpfee != bump_fees.end());
        BOOST_CHECK_EQUAL(tx0_bumpfee->second, very_high_feerate.GetFee(tx_vsizes[0]) - low_fee);
        const auto tx3_bumpfee = bump_fees.find(COutPoint{tx3->GetHash(), 0});
        BOOST_CHECK(tx3_bumpfee != bump_fees.end());
        BOOST_CHECK_EQUAL(tx3_bumpfee->second,
            very_high_feerate.GetFee(tx_vsizes[0] + tx_vsizes[1] + tx_vsizes[2] + tx_vsizes[3]) - (low_fee + med_fee + high_fee + high_fee));
        const auto tx6_bumpfee = bump_fees.find(COutPoint{tx6->GetHash(), 0});
        BOOST_CHECK(tx6_bumpfee != bump_fees.end());
        BOOST_CHECK_EQUAL(tx6_bumpfee->second,
            very_high_feerate.GetFee(tx_vsizes[4] + tx_vsizes[5] + tx_vsizes[6]) - (high_fee + low_fee + med_fee));
        const auto tx7_bumpfee = bump_fees.find(COutPoint{tx7->GetHash(), 0});
        BOOST_CHECK(tx7_bumpfee != bump_fees.end());
        BOOST_CHECK_EQUAL(tx7_bumpfee->second,
            very_high_feerate.GetFee(tx_vsizes[4] + tx_vsizes[5] + tx_vsizes[7]) - (high_fee + low_fee + high_fee));
        // Total fees: if spending multiple outputs from tx3 don't double-count fees.
        node::MiniMiner mini_miner_total_tx3(pool, {COutPoint{tx3->GetHash(), 0}, COutPoint{tx3->GetHash(), 1}});
        BOOST_CHECK(mini_miner_total_tx3.IsReadyToCalculate());
        const auto tx3_bump_fee = mini_miner_total_tx3.CalculateTotalBumpFees(very_high_feerate);
        BOOST_CHECK(!mini_miner_total_tx3.IsReadyToCalculate());
        BOOST_CHECK(tx3_bump_fee.has_value());
        BOOST_CHECK_EQUAL(tx3_bump_fee.value(),
            very_high_feerate.GetFee(tx_vsizes[0] + tx_vsizes[1] + tx_vsizes[2] + tx_vsizes[3]) - (low_fee + med_fee + high_fee + high_fee));
        // Total fees: if spending both tx6 and tx7, don't double-count fees.
        node::MiniMiner mini_miner_tx6_tx7(pool, {COutPoint{tx6->GetHash(), 0}, COutPoint{tx7->GetHash(), 0}});
        BOOST_CHECK(mini_miner_tx6_tx7.IsReadyToCalculate());
        const auto tx6_tx7_bumpfee = mini_miner_tx6_tx7.CalculateTotalBumpFees(very_high_feerate);
        BOOST_CHECK(!mini_miner_tx6_tx7.IsReadyToCalculate());
        BOOST_CHECK(tx6_tx7_bumpfee.has_value());
        BOOST_CHECK_EQUAL(tx6_tx7_bumpfee.value(),
            very_high_feerate.GetFee(tx_vsizes[4] + tx_vsizes[5] + tx_vsizes[6] + tx_vsizes[7]) - (high_fee + low_fee + med_fee + high_fee));
    }
    // Feerate just below tx4: tx6 and tx7 have different bump fees.
    {
        const auto just_below_tx4 = CFeeRate(tx4_feerate.GetFeePerK() - 5);
        node::MiniMiner mini_miner(pool, all_unspent_outpoints);
        BOOST_CHECK(mini_miner.IsReadyToCalculate());
        auto bump_fees = mini_miner.CalculateBumpFees(just_below_tx4);
        BOOST_CHECK(!mini_miner.IsReadyToCalculate());
        BOOST_CHECK_EQUAL(bump_fees.size(), all_unspent_outpoints.size());
        BOOST_CHECK(sanity_check(all_transactions, bump_fees));
        const auto tx6_bumpfee = bump_fees.find(COutPoint{tx6->GetHash(), 0});
        BOOST_CHECK(tx6_bumpfee != bump_fees.end());
        BOOST_CHECK_EQUAL(tx6_bumpfee->second, just_below_tx4.GetFee(tx_vsizes[5] + tx_vsizes[6]) - (low_fee + med_fee));
        const auto tx7_bumpfee = bump_fees.find(COutPoint{tx7->GetHash(), 0});
        BOOST_CHECK(tx7_bumpfee != bump_fees.end());
        BOOST_CHECK_EQUAL(tx7_bumpfee->second, just_below_tx4.GetFee(tx_vsizes[5] + tx_vsizes[7]) - (low_fee + high_fee));
        // Total fees: if spending both tx6 and tx7, don't double-count fees.
        node::MiniMiner mini_miner_tx6_tx7(pool, {COutPoint{tx6->GetHash(), 0}, COutPoint{tx7->GetHash(), 0}});
        BOOST_CHECK(mini_miner_tx6_tx7.IsReadyToCalculate());
        const auto tx6_tx7_bumpfee = mini_miner_tx6_tx7.CalculateTotalBumpFees(just_below_tx4);
        BOOST_CHECK(!mini_miner_tx6_tx7.IsReadyToCalculate());
        BOOST_CHECK(tx6_tx7_bumpfee.has_value());
        BOOST_CHECK_EQUAL(tx6_tx7_bumpfee.value(), just_below_tx4.GetFee(tx_vsizes[5] + tx_vsizes[6]) - (low_fee + med_fee));
    }
    // Feerate between tx6 and tx7's ancestor feerates: don't need to bump tx5 because tx7 already does.
    {
        const auto just_above_tx6 = CFeeRate(med_fee + 10, tx_vsizes[6]);
        BOOST_CHECK(just_above_tx6 <= CFeeRate(low_fee + high_fee, tx_vsizes[5] + tx_vsizes[7]));
        node::MiniMiner mini_miner(pool, all_unspent_outpoints);
        BOOST_CHECK(mini_miner.IsReadyToCalculate());
        auto bump_fees = mini_miner.CalculateBumpFees(just_above_tx6);
        BOOST_CHECK(!mini_miner.IsReadyToCalculate());
        BOOST_CHECK_EQUAL(bump_fees.size(), all_unspent_outpoints.size());
        BOOST_CHECK(sanity_check(all_transactions, bump_fees));
        const auto tx6_bumpfee = bump_fees.find(COutPoint{tx6->GetHash(), 0});
        BOOST_CHECK(tx6_bumpfee != bump_fees.end());
        BOOST_CHECK_EQUAL(tx6_bumpfee->second, just_above_tx6.GetFee(tx_vsizes[6]) - (med_fee));
        const auto tx7_bumpfee = bump_fees.find(COutPoint{tx7->GetHash(), 0});
        BOOST_CHECK(tx7_bumpfee != bump_fees.end());
        BOOST_CHECK_EQUAL(tx7_bumpfee->second, 0);
    }
    // Check linearization order
    std::vector<node::MiniMinerMempoolEntry> miniminer_info;
    miniminer_info.emplace_back(tx0,/*vsize_self=*/tx_vsizes[0],                     /*vsize_ancestor=*/tx_vsizes[0], /*fee_self=*/low_fee,   /*fee_ancestor=*/low_fee);
    miniminer_info.emplace_back(tx1,               tx_vsizes[1],                                        tx_vsizes[1],              med_fee,                    med_fee);
    miniminer_info.emplace_back(tx2,               tx_vsizes[2],                                        tx_vsizes[2],             high_fee,                   high_fee);
    miniminer_info.emplace_back(tx3,               tx_vsizes[3], tx_vsizes[0]+tx_vsizes[1]+tx_vsizes[2]+tx_vsizes[3],             high_fee, low_fee+med_fee+2*high_fee);
    miniminer_info.emplace_back(tx4,               tx_vsizes[4],                                        tx_vsizes[4],             high_fee,                   high_fee);
    miniminer_info.emplace_back(tx5,               tx_vsizes[5],                           tx_vsizes[4]+tx_vsizes[5],              low_fee,         low_fee + high_fee);
    miniminer_info.emplace_back(tx6,               tx_vsizes[6],              tx_vsizes[4]+tx_vsizes[5]+tx_vsizes[6],              med_fee,   high_fee+low_fee+med_fee);
    miniminer_info.emplace_back(tx7,               tx_vsizes[7],              tx_vsizes[4]+tx_vsizes[5]+tx_vsizes[7],             high_fee,  high_fee+low_fee+high_fee);

    std::map<Txid, std::set<Txid>> descendant_caches;
    descendant_caches.emplace(tx0->GetHash(), std::set<Txid>{tx0->GetHash(), tx3->GetHash()});
    descendant_caches.emplace(tx1->GetHash(), std::set<Txid>{tx1->GetHash(), tx3->GetHash()});
    descendant_caches.emplace(tx2->GetHash(), std::set<Txid>{tx2->GetHash(), tx3->GetHash()});
    descendant_caches.emplace(tx3->GetHash(), std::set<Txid>{tx3->GetHash()});
    descendant_caches.emplace(tx4->GetHash(), std::set<Txid>{tx4->GetHash(), tx5->GetHash(), tx6->GetHash(), tx7->GetHash()});
    descendant_caches.emplace(tx5->GetHash(), std::set<Txid>{tx5->GetHash(), tx6->GetHash(), tx7->GetHash()});
    descendant_caches.emplace(tx6->GetHash(), std::set<Txid>{tx6->GetHash()});
    descendant_caches.emplace(tx7->GetHash(), std::set<Txid>{tx7->GetHash()});

    node::MiniMiner miniminer_manual(miniminer_info, descendant_caches);
    // Use unspent outpoints to avoid entries being omitted.
    node::MiniMiner miniminer_pool(pool, all_unspent_outpoints);
    BOOST_CHECK(miniminer_manual.IsReadyToCalculate());
    BOOST_CHECK(miniminer_pool.IsReadyToCalculate());
    for (const auto& sequences : {miniminer_manual.Linearize(), miniminer_pool.Linearize()}) {
        // tx2 and tx4 selected first: high feerate with nothing to bump
        BOOST_CHECK_EQUAL(Find(sequences, tx4->GetHash()), 0);
        BOOST_CHECK_EQUAL(Find(sequences, tx2->GetHash()), 1);

        // tx5 + tx7 CPFP
        BOOST_CHECK_EQUAL(Find(sequences, tx5->GetHash()), 2);
        BOOST_CHECK_EQUAL(Find(sequences, tx7->GetHash()), 2);

        // tx0 and tx1 CPFP'd by tx3
        BOOST_CHECK_EQUAL(Find(sequences, tx0->GetHash()), 3);
        BOOST_CHECK_EQUAL(Find(sequences, tx1->GetHash()), 3);
        BOOST_CHECK_EQUAL(Find(sequences, tx3->GetHash()), 3);

        // tx6 at medium feerate
        BOOST_CHECK_EQUAL(Find(sequences, tx6->GetHash()), 4);
    }
}